

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersector1<8>::
     occluded_hn<embree::avx512::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  ulong uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  __int_type_conflict _Var11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  byte bVar26;
  uint uVar27;
  ulong uVar28;
  long lVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar63 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  int iVar103;
  undefined4 uVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  vfloat4 a0;
  undefined1 auVar109 [16];
  vfloat4 a0_1;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  vfloat4 b0;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar127;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  vfloat4 b0_1;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  float fVar161;
  float fVar162;
  __m128 a;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar163;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  vfloat4 a0_2;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar193;
  float fVar204;
  float fVar205;
  vfloat4 b0_2;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar206;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  vfloat4 a0_3;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  long local_270;
  ulong local_268;
  Primitive *local_260;
  RTCFilterFunctionNArguments local_258;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  uint auStack_1a8 [4];
  undefined8 local_198;
  undefined4 local_190;
  undefined8 local_18c;
  undefined4 local_184;
  uint local_180;
  uint local_17c;
  uint local_178;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined8 uStack_98;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar29;
  undefined1 auVar85 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar225 [32];
  
  uVar28 = (ulong)(byte)prim[1];
  lVar34 = uVar28 * 0x25;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar28 * 4 + 6);
  auVar82 = vpmovsxbd_avx2(auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar28 * 5 + 6);
  auVar79 = vpmovsxbd_avx2(auVar42);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar28 * 6 + 6);
  auVar80 = vpmovsxbd_avx2(auVar55);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar28 * 0xf + 6);
  auVar86 = vpmovsxbd_avx2(auVar56);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar83 = vpmovsxbd_avx2(auVar60);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar28 * 0x11 + 6);
  auVar81 = vpmovsxbd_avx2(auVar59);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar28 * 0x1a + 6);
  auVar78 = vpmovsxbd_avx2(auVar61);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar28 * 0x1b + 6);
  auVar72 = vpmovsxbd_avx2(auVar62);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(prim + lVar34 + 0x12)));
  auVar42 = vsubps_avx512vl((undefined1  [16])(ray->org).field_0,
                            *(undefined1 (*) [16])(prim + lVar34 + 6));
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar28 * 0x1c + 6);
  auVar73 = vpmovsxbd_avx2(auVar43);
  fVar209 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar34 + 0x16)) *
            *(float *)(prim + lVar34 + 0x1a);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 7 + 6));
  auVar64 = vpbroadcastd_avx512vl();
  auVar65 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar28 * 0xb + 6));
  auVar66 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar28 * 9 + 6));
  auVar234 = ZEXT3264(auVar66);
  auVar67 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar28 * 0xd + 6));
  auVar235 = ZEXT3264(auVar67);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x12 + 6));
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x16 + 6));
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x14 + 6));
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x18 + 6));
  auVar42 = vmulps_avx512vl(auVar41,auVar42);
  auVar41 = vmulps_avx512vl(auVar41,(undefined1  [16])(ray->dir).field_0);
  auVar68 = vcvtdq2ps_avx512vl(auVar82);
  auVar69 = vcvtdq2ps_avx512vl(auVar79);
  auVar70 = vcvtdq2ps_avx512vl(auVar80);
  auVar71 = vcvtdq2ps_avx512vl(auVar86);
  auVar82 = vcvtdq2ps_avx(auVar83);
  auVar80 = vcvtdq2ps_avx(auVar81);
  auVar86 = vcvtdq2ps_avx(auVar78);
  auVar83 = vcvtdq2ps_avx(auVar72);
  auVar81 = vcvtdq2ps_avx(auVar73);
  auVar72 = vbroadcastss_avx512vl(auVar41);
  auVar73 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar74 = vpermps_avx512vl(auVar73,ZEXT1632(auVar41));
  auVar75 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar76 = vpermps_avx512vl(auVar75,ZEXT1632(auVar41));
  auVar77 = vmulps_avx512vl(auVar76,auVar70);
  auVar78._4_4_ = auVar76._4_4_ * auVar80._4_4_;
  auVar78._0_4_ = auVar76._0_4_ * auVar80._0_4_;
  auVar78._8_4_ = auVar76._8_4_ * auVar80._8_4_;
  auVar78._12_4_ = auVar76._12_4_ * auVar80._12_4_;
  auVar78._16_4_ = auVar76._16_4_ * auVar80._16_4_;
  auVar78._20_4_ = auVar76._20_4_ * auVar80._20_4_;
  auVar78._24_4_ = auVar76._24_4_ * auVar80._24_4_;
  auVar78._28_4_ = auVar79._28_4_;
  auVar79._4_4_ = auVar81._4_4_ * auVar76._4_4_;
  auVar79._0_4_ = auVar81._0_4_ * auVar76._0_4_;
  auVar79._8_4_ = auVar81._8_4_ * auVar76._8_4_;
  auVar79._12_4_ = auVar81._12_4_ * auVar76._12_4_;
  auVar79._16_4_ = auVar81._16_4_ * auVar76._16_4_;
  auVar79._20_4_ = auVar81._20_4_ * auVar76._20_4_;
  auVar79._24_4_ = auVar81._24_4_ * auVar76._24_4_;
  auVar79._28_4_ = auVar76._28_4_;
  auVar76 = vfmadd231ps_avx512vl(auVar77,auVar74,auVar69);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar74,auVar82);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar83,auVar74);
  auVar74 = vfmadd231ps_avx512vl(auVar76,auVar72,auVar68);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar72,auVar71);
  auVar41 = vfmadd231ps_fma(auVar79,auVar86,auVar72);
  auVar79 = vbroadcastss_avx512vl(auVar42);
  auVar72 = vpermps_avx512vl(auVar73,ZEXT1632(auVar42));
  auVar73 = vpermps_avx512vl(auVar75,ZEXT1632(auVar42));
  auVar70 = vmulps_avx512vl(auVar73,auVar70);
  auVar80 = vmulps_avx512vl(auVar73,auVar80);
  auVar81 = vmulps_avx512vl(auVar73,auVar81);
  auVar73 = vfmadd231ps_avx512vl(auVar70,auVar72,auVar69);
  auVar82 = vfmadd231ps_avx512vl(auVar80,auVar72,auVar82);
  auVar80 = vfmadd231ps_avx512vl(auVar81,auVar72,auVar83);
  auVar83 = vfmadd231ps_avx512vl(auVar73,auVar79,auVar68);
  auVar81 = vfmadd231ps_avx512vl(auVar82,auVar79,auVar71);
  auVar241 = ZEXT3264(auVar81);
  auVar70._16_16_ = vfmadd231ps_fma(auVar80,auVar79,auVar86);
  auVar75._8_4_ = 0x7fffffff;
  auVar75._0_8_ = 0x7fffffff7fffffff;
  auVar75._12_4_ = 0x7fffffff;
  auVar75._16_4_ = 0x7fffffff;
  auVar75._20_4_ = 0x7fffffff;
  auVar75._24_4_ = 0x7fffffff;
  auVar75._28_4_ = 0x7fffffff;
  auVar82 = vandps_avx(auVar74,auVar75);
  auVar76._8_4_ = 0x219392ef;
  auVar76._0_8_ = 0x219392ef219392ef;
  auVar76._12_4_ = 0x219392ef;
  auVar76._16_4_ = 0x219392ef;
  auVar76._20_4_ = 0x219392ef;
  auVar76._24_4_ = 0x219392ef;
  auVar76._28_4_ = 0x219392ef;
  uVar35 = vcmpps_avx512vl(auVar82,auVar76,1);
  bVar36 = (bool)((byte)uVar35 & 1);
  auVar68._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar74._0_4_;
  bVar36 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar74._4_4_;
  bVar36 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar74._8_4_;
  bVar36 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar74._12_4_;
  bVar36 = (bool)((byte)(uVar35 >> 4) & 1);
  auVar68._16_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar74._16_4_;
  bVar36 = (bool)((byte)(uVar35 >> 5) & 1);
  auVar68._20_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar74._20_4_;
  bVar36 = (bool)((byte)(uVar35 >> 6) & 1);
  auVar68._24_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar74._24_4_;
  bVar36 = SUB81(uVar35 >> 7,0);
  auVar68._28_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar74._28_4_;
  auVar82 = vandps_avx(auVar78,auVar75);
  uVar35 = vcmpps_avx512vl(auVar82,auVar76,1);
  bVar36 = (bool)((byte)uVar35 & 1);
  auVar69._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar78._0_4_;
  bVar36 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar78._4_4_;
  bVar36 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar78._8_4_;
  bVar36 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar69._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar78._12_4_;
  bVar36 = (bool)((byte)(uVar35 >> 4) & 1);
  auVar69._16_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar78._16_4_;
  bVar36 = (bool)((byte)(uVar35 >> 5) & 1);
  auVar69._20_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar78._20_4_;
  bVar36 = (bool)((byte)(uVar35 >> 6) & 1);
  auVar69._24_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar78._24_4_;
  bVar36 = SUB81(uVar35 >> 7,0);
  auVar69._28_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar78._28_4_;
  auVar82 = vandps_avx(ZEXT1632(auVar41),auVar75);
  uVar35 = vcmpps_avx512vl(auVar82,auVar76,1);
  bVar36 = (bool)((byte)uVar35 & 1);
  auVar82._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar41._0_4_;
  bVar36 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar41._4_4_;
  bVar36 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar41._8_4_;
  bVar36 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar41._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar74._8_4_ = 0x3f800000;
  auVar74._0_8_ = 0x3f8000003f800000;
  auVar74._12_4_ = 0x3f800000;
  auVar74._16_4_ = 0x3f800000;
  auVar74._20_4_ = 0x3f800000;
  auVar74._24_4_ = 0x3f800000;
  auVar74._28_4_ = 0x3f800000;
  auVar80 = vrcp14ps_avx512vl(auVar68);
  auVar41 = vfnmadd213ps_fma(auVar68,auVar80,auVar74);
  auVar41 = vfmadd132ps_fma(ZEXT1632(auVar41),auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar69);
  auVar42 = vfnmadd213ps_fma(auVar69,auVar80,auVar74);
  auVar42 = vfmadd132ps_fma(ZEXT1632(auVar42),auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar82);
  auVar55 = vfnmadd213ps_fma(auVar82,auVar80,auVar74);
  auVar55 = vfmadd132ps_fma(ZEXT1632(auVar55),auVar80,auVar80);
  auVar71._4_4_ = fVar209;
  auVar71._0_4_ = fVar209;
  auVar71._8_4_ = fVar209;
  auVar71._12_4_ = fVar209;
  auVar71._16_4_ = fVar209;
  auVar71._20_4_ = fVar209;
  auVar71._24_4_ = fVar209;
  auVar71._28_4_ = fVar209;
  auVar82 = vcvtdq2ps_avx(auVar87);
  auVar80 = vcvtdq2ps_avx512vl(auVar65);
  auVar80 = vsubps_avx(auVar80,auVar82);
  auVar56 = vfmadd213ps_fma(auVar80,auVar71,auVar82);
  auVar80 = vcvtdq2ps_avx512vl(auVar66);
  auVar82 = vcvtdq2ps_avx512vl(auVar67);
  auVar82 = vsubps_avx(auVar82,auVar80);
  auVar60 = vfmadd213ps_fma(auVar82,auVar71,auVar80);
  auVar82 = vcvtdq2ps_avx(auVar88);
  auVar80 = vcvtdq2ps_avx(auVar89);
  auVar80 = vsubps_avx(auVar80,auVar82);
  auVar59 = vfmadd213ps_fma(auVar80,auVar71,auVar82);
  auVar82 = vcvtdq2ps_avx(auVar90);
  auVar80 = vcvtdq2ps_avx(auVar91);
  auVar80 = vsubps_avx(auVar80,auVar82);
  auVar61 = vfmadd213ps_fma(auVar80,auVar71,auVar82);
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x1d + 6));
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x21 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar82);
  auVar62 = vfmadd213ps_fma(auVar80,auVar71,auVar82);
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x1f + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x23 + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar82);
  auVar43 = vfmadd213ps_fma(auVar80,auVar71,auVar82);
  auVar82 = vsubps_avx512vl(ZEXT1632(auVar56),auVar83);
  auVar72._4_4_ = auVar41._4_4_ * auVar82._4_4_;
  auVar72._0_4_ = auVar41._0_4_ * auVar82._0_4_;
  auVar72._8_4_ = auVar41._8_4_ * auVar82._8_4_;
  auVar72._12_4_ = auVar41._12_4_ * auVar82._12_4_;
  auVar72._16_4_ = auVar82._16_4_ * 0.0;
  auVar72._20_4_ = auVar82._20_4_ * 0.0;
  auVar72._24_4_ = auVar82._24_4_ * 0.0;
  auVar72._28_4_ = auVar82._28_4_;
  auVar82 = vsubps_avx512vl(ZEXT1632(auVar60),auVar83);
  auVar90._0_4_ = auVar41._0_4_ * auVar82._0_4_;
  auVar90._4_4_ = auVar41._4_4_ * auVar82._4_4_;
  auVar90._8_4_ = auVar41._8_4_ * auVar82._8_4_;
  auVar90._12_4_ = auVar41._12_4_ * auVar82._12_4_;
  auVar90._16_4_ = auVar82._16_4_ * 0.0;
  auVar90._20_4_ = auVar82._20_4_ * 0.0;
  auVar90._24_4_ = auVar82._24_4_ * 0.0;
  auVar90._28_4_ = 0;
  auVar82 = vsubps_avx512vl(ZEXT1632(auVar59),auVar81);
  auVar73._4_4_ = auVar42._4_4_ * auVar82._4_4_;
  auVar73._0_4_ = auVar42._0_4_ * auVar82._0_4_;
  auVar73._8_4_ = auVar42._8_4_ * auVar82._8_4_;
  auVar73._12_4_ = auVar42._12_4_ * auVar82._12_4_;
  auVar73._16_4_ = auVar82._16_4_ * 0.0;
  auVar73._20_4_ = auVar82._20_4_ * 0.0;
  auVar73._24_4_ = auVar82._24_4_ * 0.0;
  auVar73._28_4_ = auVar82._28_4_;
  auVar82 = vsubps_avx512vl(ZEXT1632(auVar61),auVar81);
  auVar89._0_4_ = auVar42._0_4_ * auVar82._0_4_;
  auVar89._4_4_ = auVar42._4_4_ * auVar82._4_4_;
  auVar89._8_4_ = auVar42._8_4_ * auVar82._8_4_;
  auVar89._12_4_ = auVar42._12_4_ * auVar82._12_4_;
  auVar89._16_4_ = auVar82._16_4_ * 0.0;
  auVar89._20_4_ = auVar82._20_4_ * 0.0;
  auVar89._24_4_ = auVar82._24_4_ * 0.0;
  auVar89._28_4_ = 0;
  auVar82 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar70._16_16_));
  auVar87._4_4_ = auVar55._4_4_ * auVar82._4_4_;
  auVar87._0_4_ = auVar55._0_4_ * auVar82._0_4_;
  auVar87._8_4_ = auVar55._8_4_ * auVar82._8_4_;
  auVar87._12_4_ = auVar55._12_4_ * auVar82._12_4_;
  auVar87._16_4_ = auVar82._16_4_ * 0.0;
  auVar87._20_4_ = auVar82._20_4_ * 0.0;
  auVar87._24_4_ = auVar82._24_4_ * 0.0;
  auVar87._28_4_ = auVar82._28_4_;
  auVar82 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar70._16_16_));
  auVar88._0_4_ = auVar55._0_4_ * auVar82._0_4_;
  auVar88._4_4_ = auVar55._4_4_ * auVar82._4_4_;
  auVar88._8_4_ = auVar55._8_4_ * auVar82._8_4_;
  auVar88._12_4_ = auVar55._12_4_ * auVar82._12_4_;
  auVar88._16_4_ = auVar82._16_4_ * 0.0;
  auVar88._20_4_ = auVar82._20_4_ * 0.0;
  auVar88._24_4_ = auVar82._24_4_ * 0.0;
  auVar88._28_4_ = 0;
  auVar82 = vpminsd_avx2(auVar72,auVar90);
  auVar80 = vpminsd_avx2(auVar73,auVar89);
  auVar82 = vmaxps_avx(auVar82,auVar80);
  auVar80 = vpminsd_avx2(auVar87,auVar88);
  uVar104 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar86._4_4_ = uVar104;
  auVar86._0_4_ = uVar104;
  auVar86._8_4_ = uVar104;
  auVar86._12_4_ = uVar104;
  auVar86._16_4_ = uVar104;
  auVar86._20_4_ = uVar104;
  auVar86._24_4_ = uVar104;
  auVar86._28_4_ = uVar104;
  auVar80 = vmaxps_avx512vl(auVar80,auVar86);
  auVar82 = vmaxps_avx(auVar82,auVar80);
  auVar80._8_4_ = 0x3f7ffffa;
  auVar80._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar80._12_4_ = 0x3f7ffffa;
  auVar80._16_4_ = 0x3f7ffffa;
  auVar80._20_4_ = 0x3f7ffffa;
  auVar80._24_4_ = 0x3f7ffffa;
  auVar80._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar82,auVar80);
  auVar82 = vpmaxsd_avx2(auVar72,auVar90);
  auVar80 = vpmaxsd_avx2(auVar73,auVar89);
  auVar82 = vminps_avx(auVar82,auVar80);
  auVar80 = vpmaxsd_avx2(auVar87,auVar88);
  fVar209 = ray->tfar;
  auVar83._4_4_ = fVar209;
  auVar83._0_4_ = fVar209;
  auVar83._8_4_ = fVar209;
  auVar83._12_4_ = fVar209;
  auVar83._16_4_ = fVar209;
  auVar83._20_4_ = fVar209;
  auVar83._24_4_ = fVar209;
  auVar83._28_4_ = fVar209;
  auVar80 = vminps_avx512vl(auVar80,auVar83);
  auVar82 = vminps_avx(auVar82,auVar80);
  auVar81._8_4_ = 0x3f800003;
  auVar81._0_8_ = 0x3f8000033f800003;
  auVar81._12_4_ = 0x3f800003;
  auVar81._16_4_ = 0x3f800003;
  auVar81._20_4_ = 0x3f800003;
  auVar81._24_4_ = 0x3f800003;
  auVar81._28_4_ = 0x3f800003;
  auVar82 = vmulps_avx512vl(auVar82,auVar81);
  uVar14 = vcmpps_avx512vl(local_78,auVar82,2);
  uVar15 = vpcmpgtd_avx512vl(auVar64,_DAT_01fb4ba0);
  uVar35 = (ulong)(byte)((byte)uVar14 & (byte)uVar15);
  auVar70._16_16_ = auVar82._16_16_;
  auVar41 = vpxord_avx512vl(auVar65._0_16_,auVar65._0_16_);
  auVar236 = ZEXT1664(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar242 = ZEXT1664(auVar41);
  local_260 = prim;
LAB_01b81a97:
  if (uVar35 == 0) {
LAB_01b838f5:
    return uVar35 != 0;
  }
  lVar34 = 0;
  for (uVar28 = uVar35; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
    lVar34 = lVar34 + 1;
  }
  uVar5 = *(uint *)(local_260 + 2);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  fVar209 = (pGVar7->time_range).lower;
  local_268 = (ulong)*(uint *)(local_260 + lVar34 * 4 + 6);
  fVar209 = pGVar7->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar209) / ((pGVar7->time_range).upper - fVar209));
  auVar41 = vroundss_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar209),9);
  auVar42 = vaddss_avx512f(ZEXT416((uint)pGVar7->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar41 = vminss_avx(auVar41,auVar42);
  auVar43 = vmaxss_avx512f(auVar236._0_16_,auVar41);
  uVar28 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           local_268 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar32 = (long)(int)auVar43._0_4_ * 0x38;
  lVar30 = *(long *)(_Var8 + 0x10 + lVar32);
  auVar41 = *(undefined1 (*) [16])(*(long *)(_Var8 + lVar32) + lVar30 * uVar28);
  lVar34 = uVar28 + 1;
  auVar42 = *(undefined1 (*) [16])(*(long *)(_Var8 + lVar32) + lVar30 * lVar34);
  lVar30 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar9 = *(long *)(lVar30 + 0x10 + lVar32);
  auVar55 = *(undefined1 (*) [16])(*(long *)(lVar30 + lVar32) + lVar9 * uVar28);
  p_Var10 = pGVar7[4].occlusionFilterN;
  auVar56 = *(undefined1 (*) [16])(*(long *)(lVar30 + lVar32) + lVar9 * lVar34);
  _Var11 = pGVar7[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar9 = *(long *)(_Var11 + 0x10 + lVar32);
  lVar12 = *(long *)(_Var8 + 0x38 + lVar32);
  lVar13 = *(long *)(_Var8 + 0x48 + lVar32);
  auVar60 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar28);
  auVar59 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar34);
  lVar12 = *(long *)(lVar30 + 0x38 + lVar32);
  lVar30 = *(long *)(lVar30 + 0x48 + lVar32);
  auVar61 = *(undefined1 (*) [16])(lVar12 + lVar30 * uVar28);
  auVar62 = *(undefined1 (*) [16])(lVar12 + lVar30 * lVar34);
  lVar30 = *(long *)(_Var11 + 0x38 + lVar32);
  lVar12 = *(long *)(_Var11 + 0x48 + lVar32);
  auVar44 = vsubss_avx512f(ZEXT416((uint)fVar209),auVar43);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar43 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var10 + lVar32) + *(long *)(p_Var10 + lVar32 + 0x10) * uVar28),
                       auVar41,auVar45);
  auVar46 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var10 + lVar32) + *(long *)(p_Var10 + lVar32 + 0x10) * lVar34),
                       auVar42,auVar45);
  auVar47 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])(*(long *)(_Var11 + lVar32) + lVar9 * uVar28),auVar55,
                       auVar45);
  auVar48 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])(*(long *)(_Var11 + lVar32) + lVar9 * lVar34),auVar56,
                       auVar45);
  auVar64._0_16_ = vxorps_avx512vl(auVar241._0_16_,auVar241._0_16_);
  auVar49 = vmulps_avx512vl(auVar42,auVar64._0_16_);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar46,auVar64._0_16_);
  auVar50 = vpxord_avx512vl(auVar234._0_16_,auVar234._0_16_);
  auVar50 = vfmadd213ps_avx512vl(auVar50,auVar43,auVar49);
  auVar50 = vaddps_avx512vl(auVar41,auVar50);
  auVar63 = auVar242._0_16_;
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar43,auVar63);
  auVar49 = vfnmadd231ps_avx512vl(auVar49,auVar41,auVar63);
  auVar51 = vmulps_avx512vl(auVar56,auVar64._0_16_);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar48,auVar64._0_16_);
  auVar52 = vpxord_avx512vl(auVar235._0_16_,auVar235._0_16_);
  auVar52 = vfmadd213ps_avx512vl(auVar52,auVar47,auVar51);
  auVar53 = vaddps_avx512vl(auVar55,auVar52);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar47,auVar63);
  auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar55,auVar63);
  auVar52 = vxorps_avx512vl(auVar52,auVar52);
  auVar52 = vfmadd213ps_avx512vl(auVar52,auVar46,auVar42);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar43,auVar64._0_16_);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar41,auVar64._0_16_);
  auVar42 = vmulps_avx512vl(auVar42,auVar63);
  auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar63,auVar46);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar64._0_16_,auVar43);
  auVar54 = vfnmadd231ps_avx512vl(auVar42,auVar64._0_16_,auVar41);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar48,auVar56);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar47,auVar64._0_16_);
  auVar42 = vfmadd231ps_avx512vl(auVar41,auVar55,auVar64._0_16_);
  auVar41 = vmulps_avx512vl(auVar56,auVar63);
  auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar63,auVar48);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar64._0_16_,auVar47);
  auVar46 = vfnmadd231ps_avx512vl(auVar41,auVar64._0_16_,auVar55);
  auVar41 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar55 = vshufps_avx512vl(auVar53,auVar53,0xc9);
  fVar206 = auVar49._0_4_;
  auVar57._0_4_ = fVar206 * auVar55._0_4_;
  fVar207 = auVar49._4_4_;
  auVar57._4_4_ = fVar207 * auVar55._4_4_;
  fVar208 = auVar49._8_4_;
  auVar57._8_4_ = fVar208 * auVar55._8_4_;
  fVar127 = auVar49._12_4_;
  auVar57._12_4_ = fVar127 * auVar55._12_4_;
  auVar55 = vfmsub231ps_avx512vl(auVar57,auVar41,auVar53);
  auVar55 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar56 = vshufps_avx512vl(auVar51,auVar51,0xc9);
  auVar143._0_4_ = fVar206 * auVar56._0_4_;
  auVar143._4_4_ = fVar207 * auVar56._4_4_;
  auVar143._8_4_ = fVar208 * auVar56._8_4_;
  auVar143._12_4_ = fVar127 * auVar56._12_4_;
  auVar41 = vfmsub231ps_avx512vl(auVar143,auVar41,auVar51);
  auVar56 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar47 = vshufps_avx512vl(auVar54,auVar54,0xc9);
  auVar41 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar41 = vmulps_avx512vl(auVar54,auVar41);
  auVar41 = vfmsub231ps_fma(auVar41,auVar47,auVar42);
  auVar43 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar41 = vmulps_avx512vl(auVar54,auVar41);
  auVar41 = vfmsub231ps_fma(auVar41,auVar47,auVar46);
  auVar46 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vdpps_avx(auVar55,auVar55,0x7f);
  auVar64._16_16_ = auVar70._16_16_;
  auVar91._4_28_ = auVar64._4_28_;
  auVar91._0_4_ = auVar41._0_4_;
  auVar42 = vrsqrt14ss_avx512f(auVar64._0_16_,auVar91._0_16_);
  auVar47 = vmulss_avx512f(auVar42,ZEXT416(0x3fc00000));
  auVar48 = vmulss_avx512f(auVar41,ZEXT416(0x3f000000));
  auVar48 = vmulss_avx512f(auVar48,auVar42);
  auVar42 = vmulss_avx512f(auVar48,ZEXT416((uint)(auVar42._0_4_ * auVar42._0_4_)));
  fVar204 = auVar47._0_4_ - auVar42._0_4_;
  auVar42 = vdpps_avx(auVar55,auVar56,0x7f);
  auVar164._4_4_ = fVar204;
  auVar164._0_4_ = fVar204;
  auVar164._8_4_ = fVar204;
  auVar164._12_4_ = fVar204;
  auVar47 = vmulps_avx512vl(auVar55,auVar164);
  auVar48 = vbroadcastss_avx512vl(auVar41);
  auVar56 = vmulps_avx512vl(auVar48,auVar56);
  fVar209 = auVar42._0_4_;
  auVar128._0_4_ = fVar209 * auVar55._0_4_;
  auVar128._4_4_ = fVar209 * auVar55._4_4_;
  auVar128._8_4_ = fVar209 * auVar55._8_4_;
  auVar128._12_4_ = fVar209 * auVar55._12_4_;
  auVar55 = vsubps_avx(auVar56,auVar128);
  auVar42 = vrcp14ss_avx512f(auVar64._0_16_,auVar91._0_16_);
  auVar41 = vfnmadd213ss_avx512f(auVar41,auVar42,ZEXT416(0x40000000));
  fVar209 = auVar42._0_4_ * auVar41._0_4_;
  auVar41 = vdpps_avx(auVar43,auVar43,0x7f);
  auVar66._16_16_ = auVar70._16_16_;
  auVar66._0_16_ = auVar64._0_16_;
  auVar65._4_28_ = auVar66._4_28_;
  auVar65._0_4_ = auVar41._0_4_;
  auVar42 = vrsqrt14ss_avx512f(auVar64._0_16_,auVar65._0_16_);
  auVar56 = vmulss_avx512f(auVar42,ZEXT416(0x3fc00000));
  auVar48 = vmulss_avx512f(auVar41,ZEXT416(0x3f000000));
  fVar193 = auVar42._0_4_;
  fVar205 = auVar56._0_4_ - auVar48._0_4_ * fVar193 * fVar193 * fVar193;
  auVar42 = vdpps_avx(auVar43,auVar46,0x7f);
  auVar173._0_4_ = auVar43._0_4_ * fVar205;
  auVar173._4_4_ = auVar43._4_4_ * fVar205;
  auVar173._8_4_ = auVar43._8_4_ * fVar205;
  auVar173._12_4_ = auVar43._12_4_ * fVar205;
  auVar56 = vbroadcastss_avx512vl(auVar41);
  auVar56 = vmulps_avx512vl(auVar56,auVar46);
  fVar193 = auVar42._0_4_;
  auVar48._0_4_ = fVar193 * auVar43._0_4_;
  auVar48._4_4_ = fVar193 * auVar43._4_4_;
  auVar48._8_4_ = fVar193 * auVar43._8_4_;
  auVar48._12_4_ = fVar193 * auVar43._12_4_;
  auVar42 = vsubps_avx(auVar56,auVar48);
  auVar56 = vrcp14ss_avx512f(auVar64._0_16_,auVar65._0_16_);
  auVar41 = vfnmadd213ss_avx512f(auVar41,auVar56,ZEXT416(0x40000000));
  fVar193 = auVar56._0_4_ * auVar41._0_4_;
  auVar56 = vshufps_avx512vl(auVar50,auVar50,0xff);
  auVar43 = vmulps_avx512vl(auVar56,auVar47);
  auVar48 = vsubps_avx512vl(auVar50,auVar43);
  auVar41 = vshufps_avx(auVar49,auVar49,0xff);
  auVar41 = vmulps_avx512vl(auVar41,auVar47);
  auVar129._0_4_ = auVar41._0_4_ + auVar56._0_4_ * fVar204 * fVar209 * auVar55._0_4_;
  auVar129._4_4_ = auVar41._4_4_ + auVar56._4_4_ * fVar204 * fVar209 * auVar55._4_4_;
  auVar129._8_4_ = auVar41._8_4_ + auVar56._8_4_ * fVar204 * fVar209 * auVar55._8_4_;
  auVar129._12_4_ = auVar41._12_4_ + auVar56._12_4_ * fVar204 * fVar209 * auVar55._12_4_;
  auVar41 = vsubps_avx(auVar49,auVar129);
  auVar47 = vaddps_avx512vl(auVar50,auVar43);
  auVar130._0_4_ = fVar206 + auVar129._0_4_;
  auVar130._4_4_ = fVar207 + auVar129._4_4_;
  auVar130._8_4_ = fVar208 + auVar129._8_4_;
  auVar130._12_4_ = fVar127 + auVar129._12_4_;
  auVar55 = vshufps_avx512vl(auVar52,auVar52,0xff);
  auVar165._0_4_ = auVar173._0_4_ * auVar55._0_4_;
  auVar165._4_4_ = auVar173._4_4_ * auVar55._4_4_;
  auVar165._8_4_ = auVar173._8_4_ * auVar55._8_4_;
  auVar165._12_4_ = auVar173._12_4_ * auVar55._12_4_;
  auVar49 = vsubps_avx512vl(auVar52,auVar165);
  auVar56 = vshufps_avx512vl(auVar54,auVar54,0xff);
  auVar43 = vmulps_avx512vl(auVar56,auVar173);
  auVar144._0_4_ = auVar43._0_4_ + auVar55._0_4_ * fVar205 * auVar42._0_4_ * fVar193;
  auVar144._4_4_ = auVar43._4_4_ + auVar55._4_4_ * fVar205 * auVar42._4_4_ * fVar193;
  auVar144._8_4_ = auVar43._8_4_ + auVar55._8_4_ * fVar205 * auVar42._8_4_ * fVar193;
  auVar144._12_4_ = auVar43._12_4_ + auVar55._12_4_ * fVar205 * auVar42._12_4_ * fVar193;
  auVar42 = vsubps_avx512vl(auVar54,auVar144);
  auVar50 = vaddps_avx512vl(auVar52,auVar165);
  auVar55 = vaddps_avx512vl(auVar54,auVar144);
  auVar41 = vmulps_avx512vl(auVar41,auVar45);
  auVar153._0_4_ = auVar48._0_4_ + auVar41._0_4_;
  auVar153._4_4_ = auVar48._4_4_ + auVar41._4_4_;
  auVar153._8_4_ = auVar48._8_4_ + auVar41._8_4_;
  auVar153._12_4_ = auVar48._12_4_ + auVar41._12_4_;
  auVar41 = vmulps_avx512vl(auVar42,auVar45);
  auVar43 = vsubps_avx(auVar49,auVar41);
  auVar41 = vmulps_avx512vl(auVar130,auVar45);
  auVar51 = vaddps_avx512vl(auVar47,auVar41);
  auVar41 = vmulps_avx512vl(auVar55,auVar45);
  auVar46 = vsubps_avx(auVar50,auVar41);
  auVar41 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var10 + lVar32 + 0x38) +
                        *(long *)(p_Var10 + lVar32 + 0x48) * uVar28),auVar60,auVar45);
  auVar42 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var10 + lVar32 + 0x38) +
                        *(long *)(p_Var10 + lVar32 + 0x48) * lVar34),auVar59,auVar45);
  auVar55 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])(lVar30 + uVar28 * lVar12),auVar61,auVar45);
  auVar53 = vfnmadd132ps_avx512vl(*(undefined1 (*) [16])(lVar30 + lVar12 * lVar34),auVar62,auVar45);
  auVar54 = vmulps_avx512vl(auVar59,auVar64._0_16_);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar42,auVar64._0_16_);
  auVar56 = vxorps_avx512vl(auVar56,auVar56);
  auVar56 = vfmadd213ps_avx512vl(auVar56,auVar41,auVar54);
  auVar57 = vaddps_avx512vl(auVar60,auVar56);
  auVar56 = vfmadd231ps_avx512vl(auVar54,auVar41,auVar63);
  auVar54 = vfnmadd231ps_avx512vl(auVar56,auVar60,auVar63);
  auVar56 = vmulps_avx512vl(auVar62,auVar64._0_16_);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar53,auVar64._0_16_);
  auVar52 = vxorps_avx512vl(auVar52,auVar52);
  auVar52 = vfmadd213ps_avx512vl(auVar52,auVar55,auVar56);
  auVar58 = vaddps_avx512vl(auVar61,auVar52);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar55,auVar63);
  auVar56 = vfnmadd231ps_avx512vl(auVar56,auVar61,auVar63);
  auVar52 = vxorps_avx512vl(auVar52,auVar52);
  auVar52 = vfmadd213ps_avx512vl(auVar52,auVar42,auVar59);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar41,auVar64._0_16_);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar60,auVar64._0_16_);
  auVar59 = vmulps_avx512vl(auVar59,auVar63);
  auVar42 = vfnmadd231ps_avx512vl(auVar59,auVar63,auVar42);
  auVar41 = vfmadd231ps_avx512vl(auVar42,auVar64._0_16_,auVar41);
  auVar60 = vfnmadd231ps_avx512vl(auVar41,auVar64._0_16_,auVar60);
  auVar41 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar53,auVar62);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar55,auVar64._0_16_);
  auVar42 = vfmadd231ps_avx512vl(auVar41,auVar61,auVar64._0_16_);
  auVar41 = vmulps_avx512vl(auVar62,auVar63);
  auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar63,auVar53);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar64._0_16_,auVar55);
  auVar59 = vfnmadd231ps_avx512vl(auVar41,auVar64._0_16_,auVar61);
  auVar41 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar55 = vshufps_avx512vl(auVar58,auVar58,0xc9);
  fVar193 = auVar54._0_4_;
  auVar220._0_4_ = fVar193 * auVar55._0_4_;
  fVar204 = auVar54._4_4_;
  auVar220._4_4_ = fVar204 * auVar55._4_4_;
  fVar205 = auVar54._8_4_;
  auVar220._8_4_ = fVar205 * auVar55._8_4_;
  fVar206 = auVar54._12_4_;
  auVar220._12_4_ = fVar206 * auVar55._12_4_;
  auVar55 = vfmsub231ps_avx512vl(auVar220,auVar41,auVar58);
  auVar55 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar61 = vshufps_avx512vl(auVar56,auVar56,0xc9);
  auVar226._0_4_ = fVar193 * auVar61._0_4_;
  auVar226._4_4_ = fVar204 * auVar61._4_4_;
  auVar226._8_4_ = fVar205 * auVar61._8_4_;
  auVar226._12_4_ = fVar206 * auVar61._12_4_;
  auVar41 = vfmsub231ps_avx512vl(auVar226,auVar41,auVar56);
  auVar56 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vshufps_avx(auVar60,auVar60,0xc9);
  auVar61 = vshufps_avx512vl(auVar42,auVar42,0xc9);
  auVar61 = vmulps_avx512vl(auVar60,auVar61);
  auVar42 = vfmsub231ps_avx512vl(auVar61,auVar41,auVar42);
  auVar61 = vshufps_avx512vl(auVar42,auVar42,0xc9);
  auVar42 = vshufps_avx512vl(auVar59,auVar59,0xc9);
  auVar42 = vmulps_avx512vl(auVar60,auVar42);
  auVar41 = vfmsub231ps_avx512vl(auVar42,auVar41,auVar59);
  auVar59 = vshufps_avx512vl(auVar41,auVar41,0xc9);
  auVar41 = vdpps_avx(auVar55,auVar55,0x7f);
  auVar77._16_16_ = auVar70._16_16_;
  auVar77._0_16_ = auVar64._0_16_;
  auVar67._4_28_ = auVar77._4_28_;
  auVar67._0_4_ = auVar41._0_4_;
  auVar42 = vrsqrt14ss_avx512f(auVar64._0_16_,auVar67._0_16_);
  auVar62 = vmulss_avx512f(auVar42,ZEXT416(0x3fc00000));
  auVar53 = vmulss_avx512f(auVar41,ZEXT416(0x3f000000));
  auVar53 = vmulss_avx512f(auVar53,auVar42);
  auVar42 = vmulss_avx512f(auVar42,auVar42);
  auVar42 = vmulss_avx512f(auVar53,auVar42);
  auVar42 = vsubss_avx512f(auVar62,auVar42);
  auVar62 = vbroadcastss_avx512vl(auVar42);
  auVar53 = vmulps_avx512vl(auVar55,auVar62);
  auVar42 = vdpps_avx(auVar55,auVar56,0x7f);
  auVar58 = vbroadcastss_avx512vl(auVar41);
  auVar56 = vmulps_avx512vl(auVar58,auVar56);
  fVar209 = auVar42._0_4_;
  auVar58._0_4_ = auVar55._0_4_ * fVar209;
  auVar58._4_4_ = auVar55._4_4_ * fVar209;
  auVar58._8_4_ = auVar55._8_4_ * fVar209;
  auVar58._12_4_ = auVar55._12_4_ * fVar209;
  auVar42 = vsubps_avx(auVar56,auVar58);
  auVar55 = vrcp14ss_avx512f(auVar64._0_16_,auVar67._0_16_);
  auVar41 = vfnmadd213ss_avx512f(auVar41,auVar55,ZEXT416(0x40000000));
  fVar209 = auVar55._0_4_ * auVar41._0_4_;
  auVar41 = vdpps_avx(auVar61,auVar61,0x7f);
  auVar63._0_4_ = fVar209 * auVar42._0_4_;
  auVar63._4_4_ = fVar209 * auVar42._4_4_;
  auVar63._8_4_ = fVar209 * auVar42._8_4_;
  auVar63._12_4_ = fVar209 * auVar42._12_4_;
  auVar55 = vmulps_avx512vl(auVar62,auVar63);
  auVar85._16_16_ = auVar70._16_16_;
  auVar85._0_16_ = auVar64._0_16_;
  auVar84._4_28_ = auVar85._4_28_;
  auVar84._0_4_ = auVar41._0_4_;
  auVar42 = vrsqrt14ss_avx512f(auVar64._0_16_,auVar84._0_16_);
  auVar56 = vmulss_avx512f(auVar42,ZEXT416(0x3fc00000));
  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar62 = vmulss_avx512f(auVar41,ZEXT416(0x3f000000));
  auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar244 = ZEXT1664(auVar63);
  auVar62 = vmulss_avx512f(auVar62,auVar42);
  auVar42 = vmulss_avx512f(auVar62,ZEXT416((uint)(auVar42._0_4_ * auVar42._0_4_)));
  auVar42 = vsubss_avx512f(auVar56,auVar42);
  auVar227._0_4_ = auVar42._0_4_;
  auVar227._4_4_ = auVar227._0_4_;
  auVar227._8_4_ = auVar227._0_4_;
  auVar227._12_4_ = auVar227._0_4_;
  auVar56 = vmulps_avx512vl(auVar61,auVar227);
  auVar42 = vdpps_avx(auVar61,auVar59,0x7f);
  auVar62 = vbroadcastss_avx512vl(auVar41);
  auVar59 = vmulps_avx512vl(auVar62,auVar59);
  fVar209 = auVar42._0_4_;
  auVar131._0_4_ = auVar61._0_4_ * fVar209;
  auVar131._4_4_ = auVar61._4_4_ * fVar209;
  auVar131._8_4_ = auVar61._8_4_ * fVar209;
  auVar131._12_4_ = auVar61._12_4_ * fVar209;
  auVar42 = vsubps_avx(auVar59,auVar131);
  auVar59 = vrcp14ss_avx512f(auVar64._0_16_,auVar84._0_16_);
  auVar41 = vfnmadd213ss_avx512f(auVar41,auVar59,ZEXT416(0x40000000));
  auVar243 = ZEXT464(0x3f800000);
  fVar209 = auVar59._0_4_ * auVar41._0_4_;
  auVar59 = vshufps_avx512vl(auVar57,auVar57,0xff);
  auVar61 = vmulps_avx512vl(auVar59,auVar53);
  auVar62 = vsubps_avx512vl(auVar57,auVar61);
  auVar41 = vshufps_avx(auVar54,auVar54,0xff);
  auVar41 = vmulps_avx512vl(auVar41,auVar53);
  auVar53._0_4_ = auVar41._0_4_ + auVar59._0_4_ * auVar55._0_4_;
  auVar53._4_4_ = auVar41._4_4_ + auVar59._4_4_ * auVar55._4_4_;
  auVar53._8_4_ = auVar41._8_4_ + auVar59._8_4_ * auVar55._8_4_;
  auVar53._12_4_ = auVar41._12_4_ + auVar59._12_4_ * auVar55._12_4_;
  auVar41 = vsubps_avx(auVar54,auVar53);
  auVar55 = vaddps_avx512vl(auVar57,auVar61);
  auVar54._0_4_ = fVar193 + auVar53._0_4_;
  auVar54._4_4_ = fVar204 + auVar53._4_4_;
  auVar54._8_4_ = fVar205 + auVar53._8_4_;
  auVar54._12_4_ = fVar206 + auVar53._12_4_;
  auVar59 = vshufps_avx512vl(auVar52,auVar52,0xff);
  auVar61 = vmulps_avx512vl(auVar59,auVar56);
  auVar70._16_16_ = vsubps_avx512vl(auVar52,auVar61);
  auVar53 = vshufps_avx512vl(auVar60,auVar60,0xff);
  auVar56 = vmulps_avx512vl(auVar53,auVar56);
  auVar132._0_4_ = auVar59._0_4_ * auVar227._0_4_ * fVar209 * auVar42._0_4_;
  auVar132._4_4_ = auVar59._4_4_ * auVar227._0_4_ * fVar209 * auVar42._4_4_;
  auVar132._8_4_ = auVar59._8_4_ * auVar227._0_4_ * fVar209 * auVar42._8_4_;
  auVar132._12_4_ = auVar59._12_4_ * auVar227._0_4_ * fVar209 * auVar42._12_4_;
  auVar56 = vaddps_avx512vl(auVar56,auVar132);
  auVar42 = vsubps_avx(auVar60,auVar56);
  auVar59 = vaddps_avx512vl(auVar52,auVar61);
  auVar133._0_4_ = auVar60._0_4_ + auVar56._0_4_;
  auVar133._4_4_ = auVar60._4_4_ + auVar56._4_4_;
  auVar133._8_4_ = auVar60._8_4_ + auVar56._8_4_;
  auVar133._12_4_ = auVar60._12_4_ + auVar56._12_4_;
  auVar41 = vmulps_avx512vl(auVar41,auVar45);
  auVar185._0_4_ = auVar62._0_4_ + auVar41._0_4_;
  auVar185._4_4_ = auVar62._4_4_ + auVar41._4_4_;
  auVar185._8_4_ = auVar62._8_4_ + auVar41._8_4_;
  auVar185._12_4_ = auVar62._12_4_ + auVar41._12_4_;
  auVar41 = vmulps_avx512vl(auVar42,auVar45);
  auVar41 = vsubps_avx(auVar70._16_16_,auVar41);
  auVar42 = vmulps_avx512vl(auVar54,auVar45);
  auVar52._0_4_ = auVar55._0_4_ + auVar42._0_4_;
  auVar52._4_4_ = auVar55._4_4_ + auVar42._4_4_;
  auVar52._8_4_ = auVar55._8_4_ + auVar42._8_4_;
  auVar52._12_4_ = auVar55._12_4_ + auVar42._12_4_;
  auVar42 = vmulps_avx512vl(auVar133,auVar45);
  auVar42 = vsubps_avx(auVar59,auVar42);
  auVar56 = vbroadcastss_avx512vl(auVar44);
  auVar60 = vsubss_avx512f(ZEXT416(0x3f800000),auVar44);
  auVar60 = vbroadcastss_avx512vl(auVar60);
  fVar209 = auVar56._0_4_;
  auVar216._0_4_ = fVar209 * auVar62._0_4_;
  fVar193 = auVar56._4_4_;
  auVar216._4_4_ = fVar193 * auVar62._4_4_;
  fVar204 = auVar56._8_4_;
  auVar216._8_4_ = fVar204 * auVar62._8_4_;
  fVar205 = auVar56._12_4_;
  auVar216._12_4_ = fVar205 * auVar62._12_4_;
  auVar61 = vmulps_avx512vl(auVar56,auVar185);
  auVar41 = vmulps_avx512vl(auVar56,auVar41);
  auVar228._0_4_ = fVar209 * auVar70._16_4_;
  auVar228._4_4_ = fVar193 * auVar70._20_4_;
  auVar228._8_4_ = fVar204 * auVar70._24_4_;
  auVar228._12_4_ = fVar205 * auVar70._28_4_;
  local_1b8 = vfmadd231ps_avx512vl(auVar216,auVar60,auVar48);
  local_1c8 = vfmadd231ps_avx512vl(auVar61,auVar60,auVar153);
  local_1d8 = vfmadd231ps_avx512vl(auVar41,auVar60,auVar43);
  local_1e8 = vfmadd231ps_avx512vl(auVar228,auVar60,auVar49);
  auVar41 = vmulps_avx512vl(auVar56,auVar55);
  auVar55 = vmulps_avx512vl(auVar56,auVar52);
  auVar42 = vmulps_avx512vl(auVar56,auVar42);
  auVar221._0_4_ = fVar209 * auVar59._0_4_;
  auVar221._4_4_ = fVar193 * auVar59._4_4_;
  auVar221._8_4_ = fVar204 * auVar59._8_4_;
  auVar221._12_4_ = fVar205 * auVar59._12_4_;
  _local_1f8 = vfmadd231ps_avx512vl(auVar41,auVar60,auVar47);
  _local_208 = vfmadd231ps_avx512vl(auVar55,auVar60,auVar51);
  _local_218 = vfmadd231ps_avx512vl(auVar42,auVar60,auVar46);
  _local_228 = vfmadd231ps_avx512vl(auVar221,auVar60,auVar50);
  aVar2 = (ray->org).field_0;
  auVar42 = vsubps_avx(local_1b8,(undefined1  [16])aVar2);
  uVar104 = auVar42._0_4_;
  auVar45._4_4_ = uVar104;
  auVar45._0_4_ = uVar104;
  auVar45._8_4_ = uVar104;
  auVar45._12_4_ = uVar104;
  auVar41 = vshufps_avx(auVar42,auVar42,0x55);
  aVar3 = (pre->ray_space).vx.field_0;
  aVar4 = (pre->ray_space).vy.field_0;
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  fVar209 = (pre->ray_space).vz.field_0.m128[0];
  fVar193 = (pre->ray_space).vz.field_0.m128[1];
  fVar204 = (pre->ray_space).vz.field_0.m128[2];
  fVar205 = (pre->ray_space).vz.field_0.m128[3];
  auVar44._0_4_ = fVar209 * auVar42._0_4_;
  auVar44._4_4_ = fVar193 * auVar42._4_4_;
  auVar44._8_4_ = fVar204 * auVar42._8_4_;
  auVar44._12_4_ = fVar205 * auVar42._12_4_;
  auVar41 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar4,auVar41);
  auVar60 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar45);
  auVar42 = vsubps_avx512vl(local_1c8,(undefined1  [16])aVar2);
  uVar104 = auVar42._0_4_;
  auVar49._4_4_ = uVar104;
  auVar49._0_4_ = uVar104;
  auVar49._8_4_ = uVar104;
  auVar49._12_4_ = uVar104;
  auVar41 = vshufps_avx(auVar42,auVar42,0x55);
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar47._0_4_ = fVar209 * auVar42._0_4_;
  auVar47._4_4_ = fVar193 * auVar42._4_4_;
  auVar47._8_4_ = fVar204 * auVar42._8_4_;
  auVar47._12_4_ = fVar205 * auVar42._12_4_;
  auVar41 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar4,auVar41);
  auVar59 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar49);
  auVar42 = vsubps_avx512vl(local_1d8,(undefined1  [16])aVar2);
  uVar104 = auVar42._0_4_;
  auVar145._4_4_ = uVar104;
  auVar145._0_4_ = uVar104;
  auVar145._8_4_ = uVar104;
  auVar145._12_4_ = uVar104;
  auVar41 = vshufps_avx(auVar42,auVar42,0x55);
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar50._0_4_ = fVar209 * auVar42._0_4_;
  auVar50._4_4_ = fVar193 * auVar42._4_4_;
  auVar50._8_4_ = fVar204 * auVar42._8_4_;
  auVar50._12_4_ = fVar205 * auVar42._12_4_;
  auVar41 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar4,auVar41);
  auVar61 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar145);
  auVar42 = vsubps_avx(local_1e8,(undefined1  [16])aVar2);
  uVar104 = auVar42._0_4_;
  auVar166._4_4_ = uVar104;
  auVar166._0_4_ = uVar104;
  auVar166._8_4_ = uVar104;
  auVar166._12_4_ = uVar104;
  auVar41 = vshufps_avx(auVar42,auVar42,0x55);
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar146._0_4_ = fVar209 * auVar42._0_4_;
  auVar146._4_4_ = fVar193 * auVar42._4_4_;
  auVar146._8_4_ = fVar204 * auVar42._8_4_;
  auVar146._12_4_ = fVar205 * auVar42._12_4_;
  auVar41 = vfmadd231ps_fma(auVar146,(undefined1  [16])aVar4,auVar41);
  auVar62 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar166);
  auVar42 = vsubps_avx512vl(_local_1f8,(undefined1  [16])aVar2);
  uVar104 = auVar42._0_4_;
  auVar174._4_4_ = uVar104;
  auVar174._0_4_ = uVar104;
  auVar174._8_4_ = uVar104;
  auVar174._12_4_ = uVar104;
  auVar41 = vshufps_avx(auVar42,auVar42,0x55);
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar167._0_4_ = auVar42._0_4_ * fVar209;
  auVar167._4_4_ = auVar42._4_4_ * fVar193;
  auVar167._8_4_ = auVar42._8_4_ * fVar204;
  auVar167._12_4_ = auVar42._12_4_ * fVar205;
  auVar41 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar4,auVar41);
  auVar43 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar174);
  auVar42 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar2);
  uVar104 = auVar42._0_4_;
  auVar186._4_4_ = uVar104;
  auVar186._0_4_ = uVar104;
  auVar186._8_4_ = uVar104;
  auVar186._12_4_ = uVar104;
  auVar41 = vshufps_avx(auVar42,auVar42,0x55);
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar175._0_4_ = auVar42._0_4_ * fVar209;
  auVar175._4_4_ = auVar42._4_4_ * fVar193;
  auVar175._8_4_ = auVar42._8_4_ * fVar204;
  auVar175._12_4_ = auVar42._12_4_ * fVar205;
  auVar41 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar4,auVar41);
  auVar70._16_16_ = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar186);
  auVar42 = vsubps_avx512vl(_local_218,(undefined1  [16])aVar2);
  uVar104 = auVar42._0_4_;
  auVar194._4_4_ = uVar104;
  auVar194._0_4_ = uVar104;
  auVar194._8_4_ = uVar104;
  auVar194._12_4_ = uVar104;
  auVar41 = vshufps_avx(auVar42,auVar42,0x55);
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar187._0_4_ = auVar42._0_4_ * fVar209;
  auVar187._4_4_ = auVar42._4_4_ * fVar193;
  auVar187._8_4_ = auVar42._8_4_ * fVar204;
  auVar187._12_4_ = auVar42._12_4_ * fVar205;
  auVar41 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar4,auVar41);
  auVar46 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar194);
  auVar42 = vsubps_avx(_local_228,(undefined1  [16])aVar2);
  uVar104 = auVar42._0_4_;
  auVar195._4_4_ = uVar104;
  auVar195._0_4_ = uVar104;
  auVar195._8_4_ = uVar104;
  auVar195._12_4_ = uVar104;
  auVar41 = vshufps_avx(auVar42,auVar42,0x55);
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar51._0_4_ = fVar209 * auVar42._0_4_;
  auVar51._4_4_ = fVar193 * auVar42._4_4_;
  auVar51._8_4_ = fVar204 * auVar42._8_4_;
  auVar51._12_4_ = fVar205 * auVar42._12_4_;
  auVar41 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar41);
  auVar44 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar195);
  local_288 = vmovlhps_avx(auVar60,auVar43);
  local_298 = vmovlhps_avx512f(auVar59,auVar70._16_16_);
  local_2a8 = vmovlhps_avx512f(auVar61,auVar46);
  _local_118 = vmovlhps_avx512f(auVar62,auVar44);
  auVar41 = vminps_avx512vl(local_288,local_298);
  auVar55 = vmaxps_avx512vl(local_288,local_298);
  auVar42 = vminps_avx512vl(local_2a8,_local_118);
  auVar42 = vminps_avx(auVar41,auVar42);
  auVar41 = vmaxps_avx512vl(local_2a8,_local_118);
  auVar41 = vmaxps_avx(auVar55,auVar41);
  auVar55 = vshufpd_avx(auVar42,auVar42,3);
  auVar56 = vshufpd_avx(auVar41,auVar41,3);
  auVar42 = vminps_avx(auVar42,auVar55);
  auVar41 = vmaxps_avx(auVar41,auVar56);
  auVar42 = vandps_avx512vl(auVar42,auVar63);
  auVar41 = vandps_avx512vl(auVar41,auVar63);
  auVar41 = vmaxps_avx(auVar42,auVar41);
  auVar42 = vmovshdup_avx(auVar41);
  auVar41 = vmaxss_avx(auVar42,auVar41);
  lVar34 = uVar35 + 0xff;
  local_2b8._8_8_ = auVar60._0_8_;
  local_2b8._0_8_ = auVar60._0_8_;
  local_2c8._8_8_ = auVar59._0_8_;
  local_2c8._0_8_ = auVar59._0_8_;
  local_2d8 = vmovddup_avx512vl(auVar61);
  local_2e8 = vmovddup_avx512vl(auVar62);
  register0x00001348 = auVar43._0_8_;
  local_2f8 = auVar43._0_8_;
  register0x00001388 = auVar70._16_8_;
  local_308 = auVar70._16_8_;
  register0x00001408 = auVar46._0_8_;
  local_318 = auVar46._0_8_;
  register0x00001448 = auVar44._0_8_;
  local_328 = auVar44._0_8_;
  local_128 = ZEXT416((uint)(auVar41._0_4_ * 9.536743e-07));
  local_b8 = vbroadcastss_avx512vl(local_128);
  auVar41 = vxorps_avx512vl(local_b8._0_16_,auVar58);
  local_d8 = vbroadcastss_avx512vl(auVar41);
  local_e8 = vsubps_avx512vl(local_298,local_288);
  local_f8 = vsubps_avx512vl(local_2a8,local_298);
  local_108 = vsubps_avx512vl(_local_118,local_2a8);
  local_138 = vsubps_avx512vl(_local_1f8,local_1b8);
  local_148 = vsubps_avx512vl(_local_208,local_1c8);
  local_158 = vsubps_avx512vl(_local_218,local_1d8);
  _local_168 = vsubps_avx(_local_228,local_1e8);
  bVar36 = false;
  auVar41 = ZEXT816(0x3f80000000000000);
  uVar28 = 0;
  auVar46 = auVar41;
LAB_01b82598:
  auVar42 = vshufps_avx(auVar46,auVar46,0x50);
  auVar222._8_4_ = 0x3f800000;
  auVar222._0_8_ = 0x3f8000003f800000;
  auVar222._12_4_ = 0x3f800000;
  auVar225._16_4_ = 0x3f800000;
  auVar225._0_16_ = auVar222;
  auVar225._20_4_ = 0x3f800000;
  auVar225._24_4_ = 0x3f800000;
  auVar225._28_4_ = 0x3f800000;
  auVar55 = vsubps_avx(auVar222,auVar42);
  fVar209 = auVar42._0_4_;
  auVar123._0_4_ = local_2f8._0_4_ * fVar209;
  fVar193 = auVar42._4_4_;
  auVar123._4_4_ = local_2f8._4_4_ * fVar193;
  fVar204 = auVar42._8_4_;
  auVar123._8_4_ = local_2f8._8_4_ * fVar204;
  fVar205 = auVar42._12_4_;
  auVar123._12_4_ = local_2f8._12_4_ * fVar205;
  auVar134._0_4_ = local_308._0_4_ * fVar209;
  auVar134._4_4_ = local_308._4_4_ * fVar193;
  auVar134._8_4_ = local_308._8_4_ * fVar204;
  auVar134._12_4_ = local_308._12_4_ * fVar205;
  auVar147._0_4_ = local_318._0_4_ * fVar209;
  auVar147._4_4_ = local_318._4_4_ * fVar193;
  auVar147._8_4_ = local_318._8_4_ * fVar204;
  auVar147._12_4_ = local_318._12_4_ * fVar205;
  auVar110._0_4_ = local_328._0_4_ * fVar209;
  auVar110._4_4_ = local_328._4_4_ * fVar193;
  auVar110._8_4_ = local_328._8_4_ * fVar204;
  auVar110._12_4_ = local_328._12_4_ * fVar205;
  auVar56 = vfmadd231ps_fma(auVar123,auVar55,local_2b8);
  auVar60 = vfmadd231ps_fma(auVar134,auVar55,local_2c8);
  auVar59 = vfmadd231ps_avx512vl(auVar147,auVar55,local_2d8);
  auVar55 = vfmadd231ps_avx512vl(auVar110,local_2e8,auVar55);
  auVar42 = vmovshdup_avx(auVar41);
  fVar193 = auVar41._0_4_;
  fVar209 = (auVar42._0_4_ - fVar193) * 0.04761905;
  auVar172._4_4_ = fVar193;
  auVar172._0_4_ = fVar193;
  auVar172._8_4_ = fVar193;
  auVar172._12_4_ = fVar193;
  auVar172._16_4_ = fVar193;
  auVar172._20_4_ = fVar193;
  auVar172._24_4_ = fVar193;
  auVar172._28_4_ = fVar193;
  auVar121._0_8_ = auVar42._0_8_;
  auVar121._8_8_ = auVar121._0_8_;
  auVar121._16_8_ = auVar121._0_8_;
  auVar121._24_8_ = auVar121._0_8_;
  auVar82 = vsubps_avx(auVar121,auVar172);
  uVar104 = auVar56._0_4_;
  auVar122._4_4_ = uVar104;
  auVar122._0_4_ = uVar104;
  auVar122._8_4_ = uVar104;
  auVar122._12_4_ = uVar104;
  auVar122._16_4_ = uVar104;
  auVar122._20_4_ = uVar104;
  auVar122._24_4_ = uVar104;
  auVar122._28_4_ = uVar104;
  auVar190._8_4_ = 1;
  auVar190._0_8_ = 0x100000001;
  auVar190._12_4_ = 1;
  auVar190._16_4_ = 1;
  auVar190._20_4_ = 1;
  auVar190._24_4_ = 1;
  auVar190._28_4_ = 1;
  auVar83 = ZEXT1632(auVar56);
  auVar80 = vpermps_avx2(auVar190,auVar83);
  auVar86 = vbroadcastss_avx512vl(auVar60);
  auVar81 = ZEXT1632(auVar60);
  auVar79 = vpermps_avx512vl(auVar190,auVar81);
  auVar78 = vbroadcastss_avx512vl(auVar59);
  auVar66 = ZEXT1632(auVar59);
  auVar72 = vpermps_avx512vl(auVar190,auVar66);
  auVar73 = vbroadcastss_avx512vl(auVar55);
  auVar65 = ZEXT1632(auVar55);
  auVar87 = vpermps_avx512vl(auVar190,auVar65);
  auVar191._4_4_ = fVar209;
  auVar191._0_4_ = fVar209;
  auVar191._8_4_ = fVar209;
  auVar191._12_4_ = fVar209;
  auVar191._16_4_ = fVar209;
  auVar191._20_4_ = fVar209;
  auVar191._24_4_ = fVar209;
  auVar191._28_4_ = fVar209;
  auVar88 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar89 = vpermps_avx512vl(auVar88,auVar83);
  auVar160._8_4_ = 3;
  auVar160._0_8_ = 0x300000003;
  auVar160._12_4_ = 3;
  auVar160._16_4_ = 3;
  auVar160._20_4_ = 3;
  auVar160._24_4_ = 3;
  auVar160._28_4_ = 3;
  auVar90 = vpermps_avx512vl(auVar160,auVar83);
  auVar91 = vpermps_avx512vl(auVar88,auVar81);
  auVar83 = vpermps_avx2(auVar160,auVar81);
  auVar64 = vpermps_avx512vl(auVar88,auVar66);
  auVar81 = vpermps_avx2(auVar160,auVar66);
  auVar88 = vpermps_avx512vl(auVar88,auVar65);
  auVar65 = vpermps_avx512vl(auVar160,auVar65);
  auVar42 = vfmadd132ps_fma(auVar82,auVar172,_DAT_01f7b040);
  auVar82 = vsubps_avx(auVar225,ZEXT1632(auVar42));
  auVar66 = vmulps_avx512vl(auVar86,ZEXT1632(auVar42));
  auVar68 = ZEXT1632(auVar42);
  auVar67 = vmulps_avx512vl(auVar79,auVar68);
  auVar55 = vfmadd231ps_fma(auVar66,auVar82,auVar122);
  auVar56 = vfmadd231ps_fma(auVar67,auVar82,auVar80);
  auVar66 = vmulps_avx512vl(auVar78,auVar68);
  auVar67 = vmulps_avx512vl(auVar72,auVar68);
  auVar86 = vfmadd231ps_avx512vl(auVar66,auVar82,auVar86);
  auVar79 = vfmadd231ps_avx512vl(auVar67,auVar82,auVar79);
  auVar66 = vmulps_avx512vl(auVar73,auVar68);
  auVar67 = ZEXT1632(auVar42);
  auVar87 = vmulps_avx512vl(auVar87,auVar67);
  auVar78 = vfmadd231ps_avx512vl(auVar66,auVar82,auVar78);
  auVar72 = vfmadd231ps_avx512vl(auVar87,auVar82,auVar72);
  fVar204 = auVar42._0_4_;
  fVar205 = auVar42._4_4_;
  auVar20._4_4_ = fVar205 * auVar86._4_4_;
  auVar20._0_4_ = fVar204 * auVar86._0_4_;
  fVar206 = auVar42._8_4_;
  auVar20._8_4_ = fVar206 * auVar86._8_4_;
  fVar207 = auVar42._12_4_;
  auVar20._12_4_ = fVar207 * auVar86._12_4_;
  auVar20._16_4_ = auVar86._16_4_ * 0.0;
  auVar20._20_4_ = auVar86._20_4_ * 0.0;
  auVar20._24_4_ = auVar86._24_4_ * 0.0;
  auVar20._28_4_ = fVar193;
  auVar21._4_4_ = fVar205 * auVar79._4_4_;
  auVar21._0_4_ = fVar204 * auVar79._0_4_;
  auVar21._8_4_ = fVar206 * auVar79._8_4_;
  auVar21._12_4_ = fVar207 * auVar79._12_4_;
  auVar21._16_4_ = auVar79._16_4_ * 0.0;
  auVar21._20_4_ = auVar79._20_4_ * 0.0;
  auVar21._24_4_ = auVar79._24_4_ * 0.0;
  auVar21._28_4_ = auVar80._28_4_;
  auVar55 = vfmadd231ps_fma(auVar20,auVar82,ZEXT1632(auVar55));
  auVar56 = vfmadd231ps_fma(auVar21,auVar82,ZEXT1632(auVar56));
  auVar115._0_4_ = fVar204 * auVar78._0_4_;
  auVar115._4_4_ = fVar205 * auVar78._4_4_;
  auVar115._8_4_ = fVar206 * auVar78._8_4_;
  auVar115._12_4_ = fVar207 * auVar78._12_4_;
  auVar115._16_4_ = auVar78._16_4_ * 0.0;
  auVar115._20_4_ = auVar78._20_4_ * 0.0;
  auVar115._24_4_ = auVar78._24_4_ * 0.0;
  auVar115._28_4_ = 0;
  auVar22._4_4_ = fVar205 * auVar72._4_4_;
  auVar22._0_4_ = fVar204 * auVar72._0_4_;
  auVar22._8_4_ = fVar206 * auVar72._8_4_;
  auVar22._12_4_ = fVar207 * auVar72._12_4_;
  auVar22._16_4_ = auVar72._16_4_ * 0.0;
  auVar22._20_4_ = auVar72._20_4_ * 0.0;
  auVar22._24_4_ = auVar72._24_4_ * 0.0;
  auVar22._28_4_ = auVar78._28_4_;
  auVar60 = vfmadd231ps_fma(auVar115,auVar82,auVar86);
  auVar59 = vfmadd231ps_fma(auVar22,auVar82,auVar79);
  auVar23._28_4_ = auVar79._28_4_;
  auVar23._0_28_ =
       ZEXT1628(CONCAT412(fVar207 * auVar59._12_4_,
                          CONCAT48(fVar206 * auVar59._8_4_,
                                   CONCAT44(fVar205 * auVar59._4_4_,fVar204 * auVar59._0_4_))));
  auVar61 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar207 * auVar60._12_4_,
                                               CONCAT48(fVar206 * auVar60._8_4_,
                                                        CONCAT44(fVar205 * auVar60._4_4_,
                                                                 fVar204 * auVar60._0_4_)))),auVar82
                            ,ZEXT1632(auVar55));
  auVar62 = vfmadd231ps_fma(auVar23,auVar82,ZEXT1632(auVar56));
  auVar80 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar55));
  auVar86 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar56));
  auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar80 = vmulps_avx512vl(auVar80,auVar79);
  auVar86 = vmulps_avx512vl(auVar86,auVar79);
  auVar184._0_4_ = fVar209 * auVar80._0_4_;
  auVar184._4_4_ = fVar209 * auVar80._4_4_;
  auVar184._8_4_ = fVar209 * auVar80._8_4_;
  auVar184._12_4_ = fVar209 * auVar80._12_4_;
  auVar184._16_4_ = fVar209 * auVar80._16_4_;
  auVar184._20_4_ = fVar209 * auVar80._20_4_;
  auVar184._24_4_ = fVar209 * auVar80._24_4_;
  auVar184._28_4_ = 0;
  auVar80 = vmulps_avx512vl(auVar191,auVar86);
  auVar56 = vxorps_avx512vl(auVar73._0_16_,auVar73._0_16_);
  auVar86 = vpermt2ps_avx512vl(ZEXT1632(auVar61),_DAT_01fb9fc0,ZEXT1632(auVar56));
  auVar78 = vpermt2ps_avx512vl(ZEXT1632(auVar62),_DAT_01fb9fc0,ZEXT1632(auVar56));
  auVar116._0_4_ = auVar184._0_4_ + auVar61._0_4_;
  auVar116._4_4_ = auVar184._4_4_ + auVar61._4_4_;
  auVar116._8_4_ = auVar184._8_4_ + auVar61._8_4_;
  auVar116._12_4_ = auVar184._12_4_ + auVar61._12_4_;
  auVar116._16_4_ = auVar184._16_4_ + 0.0;
  auVar116._20_4_ = auVar184._20_4_ + 0.0;
  auVar116._24_4_ = auVar184._24_4_ + 0.0;
  auVar116._28_4_ = 0;
  auVar68 = ZEXT1632(auVar56);
  auVar72 = vpermt2ps_avx512vl(auVar184,_DAT_01fb9fc0,auVar68);
  auVar73 = vaddps_avx512vl(ZEXT1632(auVar62),auVar80);
  auVar87 = vpermt2ps_avx512vl(auVar80,_DAT_01fb9fc0,auVar68);
  auVar80 = vsubps_avx(auVar86,auVar72);
  auVar72 = vsubps_avx512vl(auVar78,auVar87);
  auVar87 = vmulps_avx512vl(auVar91,auVar67);
  auVar66 = vmulps_avx512vl(auVar83,auVar67);
  auVar87 = vfmadd231ps_avx512vl(auVar87,auVar82,auVar89);
  auVar89 = vfmadd231ps_avx512vl(auVar66,auVar82,auVar90);
  auVar90 = vmulps_avx512vl(auVar64,auVar67);
  auVar66 = vmulps_avx512vl(auVar81,auVar67);
  auVar90 = vfmadd231ps_avx512vl(auVar90,auVar82,auVar91);
  auVar83 = vfmadd231ps_avx512vl(auVar66,auVar82,auVar83);
  auVar88 = vmulps_avx512vl(auVar88,auVar67);
  auVar91 = vmulps_avx512vl(auVar65,auVar67);
  auVar55 = vfmadd231ps_fma(auVar88,auVar82,auVar64);
  auVar88 = vfmadd231ps_avx512vl(auVar91,auVar82,auVar81);
  auVar91 = vmulps_avx512vl(auVar67,auVar90);
  auVar65 = ZEXT1632(auVar42);
  auVar64 = vmulps_avx512vl(auVar65,auVar83);
  auVar87 = vfmadd231ps_avx512vl(auVar91,auVar82,auVar87);
  auVar89 = vfmadd231ps_avx512vl(auVar64,auVar82,auVar89);
  auVar88 = vmulps_avx512vl(auVar65,auVar88);
  auVar90 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar207 * auVar55._12_4_,
                                          CONCAT48(fVar206 * auVar55._8_4_,
                                                   CONCAT44(fVar205 * auVar55._4_4_,
                                                            fVar204 * auVar55._0_4_)))),auVar82,
                       auVar90);
  auVar83 = vfmadd231ps_avx512vl(auVar88,auVar82,auVar83);
  auVar24._4_4_ = fVar205 * auVar90._4_4_;
  auVar24._0_4_ = fVar204 * auVar90._0_4_;
  auVar24._8_4_ = fVar206 * auVar90._8_4_;
  auVar24._12_4_ = fVar207 * auVar90._12_4_;
  auVar24._16_4_ = auVar90._16_4_ * 0.0;
  auVar24._20_4_ = auVar90._20_4_ * 0.0;
  auVar24._24_4_ = auVar90._24_4_ * 0.0;
  auVar24._28_4_ = auVar81._28_4_;
  auVar81 = vmulps_avx512vl(auVar65,auVar83);
  auVar88 = vfmadd231ps_avx512vl(auVar24,auVar82,auVar87);
  auVar81 = vfmadd231ps_avx512vl(auVar81,auVar89,auVar82);
  auVar82 = vsubps_avx512vl(auVar90,auVar87);
  auVar83 = vsubps_avx512vl(auVar83,auVar89);
  auVar82 = vmulps_avx512vl(auVar82,auVar79);
  auVar83 = vmulps_avx512vl(auVar83,auVar79);
  fVar193 = fVar209 * auVar82._0_4_;
  fVar204 = fVar209 * auVar82._4_4_;
  auVar25._4_4_ = fVar204;
  auVar25._0_4_ = fVar193;
  fVar205 = fVar209 * auVar82._8_4_;
  auVar25._8_4_ = fVar205;
  fVar206 = fVar209 * auVar82._12_4_;
  auVar25._12_4_ = fVar206;
  fVar207 = fVar209 * auVar82._16_4_;
  auVar25._16_4_ = fVar207;
  fVar208 = fVar209 * auVar82._20_4_;
  auVar25._20_4_ = fVar208;
  fVar209 = fVar209 * auVar82._24_4_;
  auVar25._24_4_ = fVar209;
  auVar25._28_4_ = auVar82._28_4_;
  auVar83 = vmulps_avx512vl(auVar191,auVar83);
  auVar79 = vpermt2ps_avx512vl(auVar88,_DAT_01fb9fc0,auVar68);
  auVar87 = vpermt2ps_avx512vl(auVar81,_DAT_01fb9fc0,auVar68);
  auVar192._0_4_ = auVar88._0_4_ + fVar193;
  auVar192._4_4_ = auVar88._4_4_ + fVar204;
  auVar192._8_4_ = auVar88._8_4_ + fVar205;
  auVar192._12_4_ = auVar88._12_4_ + fVar206;
  auVar192._16_4_ = auVar88._16_4_ + fVar207;
  auVar192._20_4_ = auVar88._20_4_ + fVar208;
  auVar192._24_4_ = auVar88._24_4_ + fVar209;
  auVar192._28_4_ = auVar88._28_4_ + auVar82._28_4_;
  auVar82 = vpermt2ps_avx512vl(auVar25,_DAT_01fb9fc0,ZEXT1632(auVar56));
  auVar89 = vaddps_avx512vl(auVar81,auVar83);
  auVar234 = ZEXT3264(auVar89);
  auVar83 = vpermt2ps_avx512vl(auVar83,_DAT_01fb9fc0,ZEXT1632(auVar56));
  auVar82 = vsubps_avx(auVar79,auVar82);
  auVar83 = vsubps_avx512vl(auVar87,auVar83);
  auVar235 = ZEXT3264(auVar83);
  auVar71 = ZEXT1632(auVar61);
  auVar90 = vsubps_avx512vl(auVar88,auVar71);
  auVar74 = ZEXT1632(auVar62);
  auVar91 = vsubps_avx512vl(auVar81,auVar74);
  auVar64 = vsubps_avx512vl(auVar79,auVar86);
  auVar90 = vaddps_avx512vl(auVar90,auVar64);
  auVar64 = vsubps_avx512vl(auVar87,auVar78);
  auVar91 = vaddps_avx512vl(auVar91,auVar64);
  auVar64 = vmulps_avx512vl(auVar74,auVar90);
  auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar71,auVar91);
  auVar65 = vmulps_avx512vl(auVar73,auVar90);
  auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar116,auVar91);
  auVar66 = vmulps_avx512vl(auVar72,auVar90);
  auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar80,auVar91);
  auVar67 = vmulps_avx512vl(auVar78,auVar90);
  auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar86,auVar91);
  auVar68 = vmulps_avx512vl(auVar81,auVar90);
  auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar88,auVar91);
  auVar69 = vmulps_avx512vl(auVar89,auVar90);
  auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar192,auVar91);
  auVar70 = vmulps_avx512vl(auVar83,auVar90);
  auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar82,auVar91);
  auVar90 = vmulps_avx512vl(auVar87,auVar90);
  auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar79,auVar91);
  auVar91 = vminps_avx512vl(auVar64,auVar65);
  auVar64 = vmaxps_avx512vl(auVar64,auVar65);
  auVar65 = vminps_avx512vl(auVar66,auVar67);
  auVar91 = vminps_avx512vl(auVar91,auVar65);
  auVar65 = vmaxps_avx512vl(auVar66,auVar67);
  auVar64 = vmaxps_avx512vl(auVar64,auVar65);
  auVar65 = vminps_avx512vl(auVar68,auVar69);
  auVar66 = vmaxps_avx512vl(auVar68,auVar69);
  auVar67 = vminps_avx512vl(auVar70,auVar90);
  auVar65 = vminps_avx512vl(auVar65,auVar67);
  auVar91 = vminps_avx512vl(auVar91,auVar65);
  auVar90 = vmaxps_avx512vl(auVar70,auVar90);
  auVar90 = vmaxps_avx512vl(auVar66,auVar90);
  auVar90 = vmaxps_avx512vl(auVar64,auVar90);
  auVar42 = auVar90._0_16_;
  uVar14 = vcmpps_avx512vl(auVar91,local_b8,2);
  uVar15 = vcmpps_avx512vl(auVar90,local_d8,5);
  bVar26 = (byte)uVar14 & (byte)uVar15 & 0x7f;
  if (bVar26 != 0) {
    auVar90 = vsubps_avx512vl(auVar86,auVar71);
    auVar91 = vsubps_avx512vl(auVar78,auVar74);
    auVar64 = vsubps_avx512vl(auVar79,auVar88);
    auVar90 = vaddps_avx512vl(auVar90,auVar64);
    auVar42 = auVar90._0_16_;
    auVar64 = vsubps_avx512vl(auVar87,auVar81);
    auVar91 = vaddps_avx512vl(auVar91,auVar64);
    auVar64 = vmulps_avx512vl(auVar74,auVar90);
    auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar91,auVar71);
    auVar73 = vmulps_avx512vl(auVar73,auVar90);
    auVar73 = vfnmadd213ps_avx512vl(auVar116,auVar91,auVar73);
    auVar72 = vmulps_avx512vl(auVar72,auVar90);
    auVar72 = vfnmadd213ps_avx512vl(auVar80,auVar91,auVar72);
    auVar80 = vmulps_avx512vl(auVar78,auVar90);
    auVar78 = vfnmadd231ps_avx512vl(auVar80,auVar91,auVar86);
    auVar80 = vmulps_avx512vl(auVar81,auVar90);
    auVar81 = vfnmadd231ps_avx512vl(auVar80,auVar91,auVar88);
    auVar80 = vmulps_avx512vl(auVar89,auVar90);
    auVar88 = vfnmadd213ps_avx512vl(auVar192,auVar91,auVar80);
    auVar80 = vmulps_avx512vl(auVar83,auVar90);
    auVar89 = vfnmadd213ps_avx512vl(auVar82,auVar91,auVar80);
    auVar82 = vmulps_avx512vl(auVar87,auVar90);
    auVar79 = vfnmadd231ps_avx512vl(auVar82,auVar79,auVar91);
    auVar80 = vminps_avx(auVar64,auVar73);
    auVar82 = vmaxps_avx(auVar64,auVar73);
    auVar86 = vminps_avx(auVar72,auVar78);
    auVar86 = vminps_avx(auVar80,auVar86);
    auVar80 = vmaxps_avx(auVar72,auVar78);
    auVar82 = vmaxps_avx(auVar82,auVar80);
    auVar83 = vminps_avx(auVar81,auVar88);
    auVar80 = vmaxps_avx(auVar81,auVar88);
    auVar81 = vminps_avx(auVar89,auVar79);
    auVar83 = vminps_avx(auVar83,auVar81);
    auVar83 = vminps_avx(auVar86,auVar83);
    auVar86 = vmaxps_avx(auVar89,auVar79);
    auVar80 = vmaxps_avx(auVar80,auVar86);
    auVar82 = vmaxps_avx(auVar82,auVar80);
    uVar14 = vcmpps_avx512vl(auVar82,local_d8,5);
    uVar15 = vcmpps_avx512vl(auVar83,local_b8,2);
    bVar26 = bVar26 & (byte)uVar14 & (byte)uVar15;
    if (bVar26 != 0) {
      auStack_1a8[uVar28] = (uint)bVar26;
      uVar14 = vmovlps_avx(auVar41);
      (&uStack_98)[uVar28] = uVar14;
      uVar1 = vmovlps_avx(auVar46);
      auStack_58[uVar28] = uVar1;
      uVar28 = (ulong)((int)uVar28 + 1);
    }
  }
  auVar41 = vxorps_avx512vl(auVar42,auVar42);
  auVar236 = ZEXT1664(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar242 = ZEXT1664(auVar41);
  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar237 = ZEXT3264(auVar82);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar238 = ZEXT1664(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar239 = ZEXT1664(auVar41);
  auVar240 = ZEXT3264(_DAT_01fb9fe0);
  auVar70._16_16_ = DAT_01fb9fe0._16_16_;
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar245 = ZEXT1664(auVar41);
LAB_01b82a93:
  do {
    do {
      do {
        auVar241 = ZEXT464(0x3eaaaaab);
        auVar42 = auVar236._0_16_;
        auVar55 = auVar242._0_16_;
        if ((int)uVar28 == 0) {
          if (bVar36) goto LAB_01b838f5;
          fVar209 = ray->tfar;
          auVar19._4_4_ = fVar209;
          auVar19._0_4_ = fVar209;
          auVar19._8_4_ = fVar209;
          auVar19._12_4_ = fVar209;
          auVar19._16_4_ = fVar209;
          auVar19._20_4_ = fVar209;
          auVar19._24_4_ = fVar209;
          auVar19._28_4_ = fVar209;
          uVar14 = vcmpps_avx512vl(local_78,auVar19,2);
          uVar35 = (ulong)((uint)uVar35 & (uint)lVar34 & (uint)uVar14);
          goto LAB_01b81a97;
        }
        uVar27 = (int)uVar28 - 1;
        uVar29 = (ulong)uVar27;
        uVar6 = auStack_1a8[uVar29];
        auVar46._8_8_ = 0;
        auVar46._0_8_ = auStack_58[uVar29];
        uVar1 = 0;
        for (uVar33 = (ulong)uVar6; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
          uVar1 = uVar1 + 1;
        }
        uVar31 = uVar6 - 1 & uVar6;
        bVar39 = uVar31 == 0;
        auStack_1a8[uVar29] = uVar31;
        if (bVar39) {
          uVar28 = (ulong)uVar27;
        }
        auVar105._8_8_ = 0;
        auVar105._0_8_ = uVar1;
        auVar41 = vpunpcklqdq_avx(auVar105,ZEXT416((int)uVar1 + 1));
        auVar41 = vcvtqq2ps_avx512vl(auVar41);
        auVar41 = vmulps_avx512vl(auVar41,auVar238._0_16_);
        uVar104 = *(undefined4 *)((long)&uStack_98 + uVar29 * 8 + 4);
        auVar16._4_4_ = uVar104;
        auVar16._0_4_ = uVar104;
        auVar16._8_4_ = uVar104;
        auVar16._12_4_ = uVar104;
        auVar56 = vmulps_avx512vl(auVar41,auVar16);
        auVar60 = auVar239._0_16_;
        auVar41 = vsubps_avx512vl(auVar60,auVar41);
        uVar104 = *(undefined4 *)(&uStack_98 + uVar29);
        auVar17._4_4_ = uVar104;
        auVar17._0_4_ = uVar104;
        auVar17._8_4_ = uVar104;
        auVar17._12_4_ = uVar104;
        auVar41 = vfmadd231ps_avx512vl(auVar56,auVar41,auVar17);
        auVar56 = vmovshdup_avx(auVar41);
        fVar209 = auVar56._0_4_ - auVar41._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar209));
        if (uVar6 == 0 || bVar39) goto LAB_01b82598;
        auVar56 = vshufps_avx(auVar46,auVar46,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar209));
        auVar62 = vsubps_avx512vl(auVar60,auVar56);
        fVar193 = auVar56._0_4_;
        auVar135._0_4_ = fVar193 * (float)local_2f8._0_4_;
        fVar204 = auVar56._4_4_;
        auVar135._4_4_ = fVar204 * (float)local_2f8._4_4_;
        fVar205 = auVar56._8_4_;
        auVar135._8_4_ = fVar205 * fStack_2f0;
        fVar206 = auVar56._12_4_;
        auVar135._12_4_ = fVar206 * fStack_2ec;
        auVar148._0_4_ = fVar193 * (float)local_308._0_4_;
        auVar148._4_4_ = fVar204 * (float)local_308._4_4_;
        auVar148._8_4_ = fVar205 * fStack_300;
        auVar148._12_4_ = fVar206 * fStack_2fc;
        auVar154._0_4_ = fVar193 * (float)local_318._0_4_;
        auVar154._4_4_ = fVar204 * (float)local_318._4_4_;
        auVar154._8_4_ = fVar205 * fStack_310;
        auVar154._12_4_ = fVar206 * fStack_30c;
        auVar117._0_4_ = fVar193 * (float)local_328._0_4_;
        auVar117._4_4_ = fVar204 * (float)local_328._4_4_;
        auVar117._8_4_ = fVar205 * fStack_320;
        auVar117._12_4_ = fVar206 * fStack_31c;
        auVar56 = vfmadd231ps_fma(auVar135,auVar62,local_2b8);
        auVar59 = vfmadd231ps_fma(auVar148,auVar62,local_2c8);
        auVar61 = vfmadd231ps_fma(auVar154,auVar62,local_2d8);
        auVar62 = vfmadd231ps_fma(auVar117,auVar62,local_2e8);
        auVar126._16_16_ = auVar56;
        auVar126._0_16_ = auVar56;
        auVar141._16_16_ = auVar59;
        auVar141._0_16_ = auVar59;
        auVar152._16_16_ = auVar61;
        auVar152._0_16_ = auVar61;
        auVar80 = vpermps_avx512vl(auVar240._0_32_,ZEXT1632(auVar41));
        auVar82 = vsubps_avx(auVar141,auVar126);
        auVar59 = vfmadd213ps_fma(auVar82,auVar80,auVar126);
        auVar82 = vsubps_avx(auVar152,auVar141);
        auVar43 = vfmadd213ps_fma(auVar82,auVar80,auVar141);
        auVar56 = vsubps_avx(auVar62,auVar61);
        auVar142._16_16_ = auVar56;
        auVar142._0_16_ = auVar56;
        auVar56 = vfmadd213ps_fma(auVar142,auVar80,auVar152);
        auVar82 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar59));
        auVar59 = vfmadd213ps_fma(auVar82,auVar80,ZEXT1632(auVar59));
        auVar82 = vsubps_avx(ZEXT1632(auVar56),ZEXT1632(auVar43));
        auVar56 = vfmadd213ps_fma(auVar82,auVar80,ZEXT1632(auVar43));
        auVar82 = vsubps_avx(ZEXT1632(auVar56),ZEXT1632(auVar59));
        auVar51 = vfmadd231ps_fma(ZEXT1632(auVar59),auVar82,auVar80);
        auVar82 = vmulps_avx512vl(auVar82,auVar237._0_32_);
        auVar70._16_16_ = auVar82._16_16_;
        auVar56 = vmulss_avx512f(ZEXT416((uint)fVar209),auVar241._0_16_);
        fVar193 = auVar56._0_4_;
        auVar155._0_8_ =
             CONCAT44(auVar51._4_4_ + fVar193 * auVar82._4_4_,
                      auVar51._0_4_ + fVar193 * auVar82._0_4_);
        auVar155._8_4_ = auVar51._8_4_ + fVar193 * auVar82._8_4_;
        auVar155._12_4_ = auVar51._12_4_ + fVar193 * auVar82._12_4_;
        auVar136._0_4_ = fVar193 * auVar82._16_4_;
        auVar136._4_4_ = fVar193 * auVar82._20_4_;
        auVar136._8_4_ = fVar193 * auVar82._24_4_;
        auVar136._12_4_ = fVar193 * auVar82._28_4_;
        auVar48 = vsubps_avx((undefined1  [16])0x0,auVar136);
        auVar43 = vshufpd_avx(auVar51,auVar51,3);
        auVar44 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar56 = vsubps_avx(auVar43,auVar51);
        auVar59 = vsubps_avx(auVar44,(undefined1  [16])0x0);
        auVar176._0_4_ = auVar56._0_4_ + auVar59._0_4_;
        auVar176._4_4_ = auVar56._4_4_ + auVar59._4_4_;
        auVar176._8_4_ = auVar56._8_4_ + auVar59._8_4_;
        auVar176._12_4_ = auVar56._12_4_ + auVar59._12_4_;
        auVar56 = vshufps_avx(auVar51,auVar51,0xb1);
        auVar59 = vshufps_avx(auVar155,auVar155,0xb1);
        auVar61 = vshufps_avx(auVar48,auVar48,0xb1);
        auVar62 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar223._4_4_ = auVar176._0_4_;
        auVar223._0_4_ = auVar176._0_4_;
        auVar223._8_4_ = auVar176._0_4_;
        auVar223._12_4_ = auVar176._0_4_;
        auVar45 = vshufps_avx(auVar176,auVar176,0x55);
        fVar193 = auVar45._0_4_;
        auVar188._0_4_ = auVar56._0_4_ * fVar193;
        fVar204 = auVar45._4_4_;
        auVar188._4_4_ = auVar56._4_4_ * fVar204;
        fVar205 = auVar45._8_4_;
        auVar188._8_4_ = auVar56._8_4_ * fVar205;
        fVar206 = auVar45._12_4_;
        auVar188._12_4_ = auVar56._12_4_ * fVar206;
        auVar196._0_4_ = auVar59._0_4_ * fVar193;
        auVar196._4_4_ = auVar59._4_4_ * fVar204;
        auVar196._8_4_ = auVar59._8_4_ * fVar205;
        auVar196._12_4_ = auVar59._12_4_ * fVar206;
        auVar210._0_4_ = auVar61._0_4_ * fVar193;
        auVar210._4_4_ = auVar61._4_4_ * fVar204;
        auVar210._8_4_ = auVar61._8_4_ * fVar205;
        auVar210._12_4_ = auVar61._12_4_ * fVar206;
        auVar177._0_4_ = auVar62._0_4_ * fVar193;
        auVar177._4_4_ = auVar62._4_4_ * fVar204;
        auVar177._8_4_ = auVar62._8_4_ * fVar205;
        auVar177._12_4_ = auVar62._12_4_ * fVar206;
        auVar56 = vfmadd231ps_fma(auVar188,auVar223,auVar51);
        auVar59 = vfmadd231ps_fma(auVar196,auVar223,auVar155);
        auVar49 = vfmadd231ps_fma(auVar210,auVar223,auVar48);
        auVar50 = vfmadd231ps_fma(auVar177,(undefined1  [16])0x0,auVar223);
        auVar45 = vshufpd_avx(auVar56,auVar56,1);
        auVar47 = vshufpd_avx(auVar59,auVar59,1);
        auVar52 = vshufpd_avx512vl(auVar49,auVar49,1);
        auVar53 = vshufpd_avx512vl(auVar50,auVar50,1);
        auVar235 = ZEXT1664(auVar53);
        auVar61 = vminss_avx(auVar56,auVar59);
        auVar56 = vmaxss_avx(auVar59,auVar56);
        auVar62 = vminss_avx(auVar49,auVar50);
        auVar59 = vmaxss_avx(auVar50,auVar49);
        auVar61 = vminss_avx(auVar61,auVar62);
        auVar56 = vmaxss_avx(auVar59,auVar56);
        auVar62 = vminss_avx(auVar45,auVar47);
        auVar59 = vmaxss_avx(auVar47,auVar45);
        auVar45 = vminss_avx512f(auVar52,auVar53);
        auVar47 = vmaxss_avx512f(auVar53,auVar52);
        auVar59 = vmaxss_avx(auVar47,auVar59);
        auVar62 = vminss_avx512f(auVar62,auVar45);
        auVar234 = ZEXT1664(auVar62);
        fVar204 = auVar59._0_4_;
        fVar193 = auVar56._0_4_;
        if (auVar61._0_4_ < 0.0001) {
          bVar40 = fVar204 == -0.0001;
          bVar37 = NAN(fVar204);
          if (fVar204 <= -0.0001) goto LAB_01b82cb5;
          break;
        }
LAB_01b82cb5:
        vucomiss_avx512f(auVar62);
        bVar40 = fVar204 <= -0.0001;
        bVar38 = -0.0001 < fVar193;
        bVar37 = bVar40;
        if (!bVar40) break;
        uVar14 = vcmpps_avx512vl(auVar61,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar15 = vcmpps_avx512vl(auVar62,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar26 = (byte)uVar14 & (byte)uVar15 & 1;
        bVar40 = bVar38 && bVar26 == 0;
        bVar37 = bVar38 && bVar26 == 0;
      } while (!bVar38 || bVar26 != 0);
      vcmpss_avx512f(auVar61,auVar42,1);
      auVar49 = auVar243._0_16_;
      uVar14 = vcmpss_avx512f(auVar56,auVar42,1);
      bVar38 = (bool)((byte)uVar14 & 1);
      auVar70._0_16_ = auVar49;
      iVar103 = auVar243._0_4_;
      auVar92._4_28_ = auVar70._4_28_;
      auVar92._0_4_ = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * iVar103);
      vucomiss_avx512f(auVar92._0_16_);
      bVar37 = (bool)(!bVar40 | bVar37);
      bVar38 = bVar37 == false;
      auVar94._16_16_ = auVar70._16_16_;
      auVar94._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar93._4_28_ = auVar94._4_28_;
      auVar93._0_4_ = (uint)bVar37 * auVar236._0_4_ + (uint)!bVar37 * 0x7f800000;
      auVar47 = auVar93._0_16_;
      auVar96._16_16_ = auVar70._16_16_;
      auVar96._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar95._4_28_ = auVar96._4_28_;
      auVar95._0_4_ = (uint)bVar37 * auVar236._0_4_ + (uint)!bVar37 * -0x800000;
      auVar45 = auVar95._0_16_;
      uVar14 = vcmpss_avx512f(auVar62,auVar42,1);
      bVar40 = (bool)((byte)uVar14 & 1);
      auVar98._16_16_ = auVar70._16_16_;
      auVar98._0_16_ = auVar49;
      auVar97._4_28_ = auVar98._4_28_;
      auVar97._0_4_ = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * iVar103);
      auVar62 = vucomiss_avx512f(auVar97._0_16_);
      auVar235 = ZEXT1664(auVar62);
      if ((bVar37) || (bVar38)) {
        auVar62 = vucomiss_avx512f(auVar61);
        if ((bVar37) || (bVar38)) {
          auVar50 = vxorps_avx512vl(auVar61,auVar245._0_16_);
          auVar235 = ZEXT1664(auVar50);
          auVar61 = vsubss_avx512f(auVar62,auVar61);
          auVar61 = vdivss_avx512f(auVar50,auVar61);
          auVar62 = vsubss_avx512f(auVar49,auVar61);
          auVar61 = vfmadd213ss_avx512f(auVar62,auVar42,auVar61);
          auVar234 = ZEXT1664(auVar61);
        }
        else {
          auVar61 = vxorps_avx512vl(auVar62,auVar62);
          auVar234 = ZEXT1664(auVar61);
          vucomiss_avx512f(auVar61);
          if ((bVar37) || (auVar61 = auVar49, bVar38)) {
            auVar234 = ZEXT464(0x7f800000);
            auVar61 = SUB6416(ZEXT464(0xff800000),0);
          }
        }
        auVar47 = vminss_avx512f(auVar47,auVar234._0_16_);
        auVar45 = vmaxss_avx(auVar61,auVar45);
      }
      uVar14 = vcmpss_avx512f(auVar59,auVar42,1);
      bVar40 = (bool)((byte)uVar14 & 1);
      fVar205 = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * iVar103);
      if ((auVar92._0_4_ != fVar205) || (NAN(auVar92._0_4_) || NAN(fVar205))) {
        if ((fVar204 != fVar193) || (NAN(fVar204) || NAN(fVar193))) {
          auVar56 = vxorps_avx512vl(auVar56,auVar245._0_16_);
          auVar178._0_4_ = auVar56._0_4_ / (fVar204 - fVar193);
          auVar178._4_12_ = auVar56._4_12_;
          auVar56 = vsubss_avx512f(auVar49,auVar178);
          auVar56 = vfmadd213ss_avx512f(auVar56,auVar42,auVar178);
          auVar59 = auVar56;
        }
        else if ((fVar193 != 0.0) ||
                (auVar56 = auVar49, auVar59 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar193))) {
          auVar56 = SUB6416(ZEXT464(0xff800000),0);
          auVar59 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar47 = vminss_avx(auVar47,auVar59);
        auVar45 = vmaxss_avx(auVar56,auVar45);
      }
      bVar40 = auVar97._0_4_ != fVar205;
      auVar56 = vminss_avx512f(auVar47,auVar49);
      auVar100._16_16_ = auVar70._16_16_;
      auVar100._0_16_ = auVar47;
      auVar99._4_28_ = auVar100._4_28_;
      auVar99._0_4_ = (uint)bVar40 * auVar56._0_4_ + (uint)!bVar40 * auVar47._0_4_;
      auVar56 = vmaxss_avx512f(auVar49,auVar45);
      auVar102._16_16_ = auVar70._16_16_;
      auVar102._0_16_ = auVar45;
      auVar101._4_28_ = auVar102._4_28_;
      auVar101._0_4_ = (uint)bVar40 * auVar56._0_4_ + (uint)!bVar40 * auVar45._0_4_;
      auVar56 = vmaxss_avx512f(auVar42,auVar99._0_16_);
      auVar59 = vminss_avx512f(auVar101._0_16_,auVar49);
    } while (auVar59._0_4_ < auVar56._0_4_);
    auVar62 = vmaxss_avx512f(auVar42,ZEXT416((uint)(auVar56._0_4_ + -0.1)));
    auVar50 = vminss_avx512f(ZEXT416((uint)(auVar59._0_4_ + 0.1)),auVar49);
    auVar118._0_8_ = auVar51._0_8_;
    auVar118._8_8_ = auVar118._0_8_;
    auVar197._8_8_ = auVar155._0_8_;
    auVar197._0_8_ = auVar155._0_8_;
    auVar211._8_8_ = auVar48._0_8_;
    auVar211._0_8_ = auVar48._0_8_;
    auVar56 = vshufpd_avx(auVar155,auVar155,3);
    auVar59 = vshufpd_avx(auVar48,auVar48,3);
    auVar61 = vshufps_avx(auVar62,auVar50,0);
    auVar47 = vsubps_avx512vl(auVar60,auVar61);
    fVar193 = auVar61._0_4_;
    auVar149._0_4_ = fVar193 * auVar43._0_4_;
    fVar204 = auVar61._4_4_;
    auVar149._4_4_ = fVar204 * auVar43._4_4_;
    fVar205 = auVar61._8_4_;
    auVar149._8_4_ = fVar205 * auVar43._8_4_;
    fVar206 = auVar61._12_4_;
    auVar149._12_4_ = fVar206 * auVar43._12_4_;
    auVar156._0_4_ = fVar193 * auVar56._0_4_;
    auVar156._4_4_ = fVar204 * auVar56._4_4_;
    auVar156._8_4_ = fVar205 * auVar56._8_4_;
    auVar156._12_4_ = fVar206 * auVar56._12_4_;
    auVar229._0_4_ = auVar59._0_4_ * fVar193;
    auVar229._4_4_ = auVar59._4_4_ * fVar204;
    auVar229._8_4_ = auVar59._8_4_ * fVar205;
    auVar229._12_4_ = auVar59._12_4_ * fVar206;
    auVar137._0_4_ = fVar193 * auVar44._0_4_;
    auVar137._4_4_ = fVar204 * auVar44._4_4_;
    auVar137._8_4_ = fVar205 * auVar44._8_4_;
    auVar137._12_4_ = fVar206 * auVar44._12_4_;
    auVar43 = vfmadd231ps_fma(auVar149,auVar47,auVar118);
    auVar44 = vfmadd231ps_fma(auVar156,auVar47,auVar197);
    auVar45 = vfmadd231ps_fma(auVar229,auVar47,auVar211);
    auVar47 = vfmadd231ps_fma(auVar137,auVar47,ZEXT816(0));
    auVar59 = vsubss_avx512f(auVar49,auVar62);
    auVar56 = vmovshdup_avx(auVar46);
    auVar51 = vfmadd231ss_fma(ZEXT416((uint)(auVar56._0_4_ * auVar62._0_4_)),auVar46,auVar59);
    auVar59 = vsubss_avx512f(auVar49,auVar50);
    auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar56._0_4_ * auVar50._0_4_)),auVar46,auVar59);
    auVar46 = vdivss_avx512f(auVar49,ZEXT416((uint)fVar209));
    auVar56 = vsubps_avx(auVar44,auVar43);
    auVar61 = vmulps_avx512vl(auVar56,auVar55);
    auVar56 = vsubps_avx(auVar45,auVar44);
    auVar62 = vmulps_avx512vl(auVar56,auVar55);
    auVar56 = vsubps_avx(auVar47,auVar45);
    auVar56 = vmulps_avx512vl(auVar56,auVar55);
    auVar59 = vminps_avx(auVar62,auVar56);
    auVar56 = vmaxps_avx(auVar62,auVar56);
    auVar59 = vminps_avx(auVar61,auVar59);
    auVar56 = vmaxps_avx(auVar61,auVar56);
    auVar61 = vshufpd_avx(auVar59,auVar59,3);
    auVar62 = vshufpd_avx(auVar56,auVar56,3);
    auVar59 = vminps_avx(auVar59,auVar61);
    auVar56 = vmaxps_avx(auVar56,auVar62);
    fVar209 = auVar46._0_4_;
    auVar179._0_4_ = auVar59._0_4_ * fVar209;
    auVar179._4_4_ = auVar59._4_4_ * fVar209;
    auVar179._8_4_ = auVar59._8_4_ * fVar209;
    auVar179._12_4_ = auVar59._12_4_ * fVar209;
    auVar168._0_4_ = fVar209 * auVar56._0_4_;
    auVar168._4_4_ = fVar209 * auVar56._4_4_;
    auVar168._8_4_ = fVar209 * auVar56._8_4_;
    auVar168._12_4_ = fVar209 * auVar56._12_4_;
    auVar48 = vdivss_avx512f(auVar49,ZEXT416((uint)(auVar52._0_4_ - auVar51._0_4_)));
    auVar56 = vshufpd_avx(auVar43,auVar43,3);
    auVar59 = vshufpd_avx(auVar44,auVar44,3);
    auVar61 = vshufpd_avx(auVar45,auVar45,3);
    auVar62 = vshufpd_avx(auVar47,auVar47,3);
    auVar56 = vsubps_avx(auVar56,auVar43);
    auVar43 = vsubps_avx(auVar59,auVar44);
    auVar46 = vsubps_avx(auVar61,auVar45);
    auVar62 = vsubps_avx(auVar62,auVar47);
    auVar59 = vminps_avx(auVar56,auVar43);
    auVar56 = vmaxps_avx(auVar56,auVar43);
    auVar61 = vminps_avx(auVar46,auVar62);
    auVar61 = vminps_avx(auVar59,auVar61);
    auVar59 = vmaxps_avx(auVar46,auVar62);
    auVar56 = vmaxps_avx(auVar56,auVar59);
    fVar209 = auVar48._0_4_;
    auVar212._0_4_ = fVar209 * auVar61._0_4_;
    auVar212._4_4_ = fVar209 * auVar61._4_4_;
    auVar212._8_4_ = fVar209 * auVar61._8_4_;
    auVar212._12_4_ = fVar209 * auVar61._12_4_;
    auVar198._0_4_ = fVar209 * auVar56._0_4_;
    auVar198._4_4_ = fVar209 * auVar56._4_4_;
    auVar198._8_4_ = fVar209 * auVar56._8_4_;
    auVar198._12_4_ = fVar209 * auVar56._12_4_;
    auVar62 = vinsertps_avx(auVar41,auVar51,0x10);
    auVar53 = vpermt2ps_avx512vl(auVar41,_DAT_01fb9f90,auVar52);
    auVar109._0_4_ = auVar62._0_4_ + auVar53._0_4_;
    auVar109._4_4_ = auVar62._4_4_ + auVar53._4_4_;
    auVar109._8_4_ = auVar62._8_4_ + auVar53._8_4_;
    auVar109._12_4_ = auVar62._12_4_ + auVar53._12_4_;
    auVar18._8_4_ = 0x3f000000;
    auVar18._0_8_ = 0x3f0000003f000000;
    auVar18._12_4_ = 0x3f000000;
    auVar47 = vmulps_avx512vl(auVar109,auVar18);
    auVar59 = vshufps_avx(auVar47,auVar47,0x54);
    uVar104 = auVar47._0_4_;
    auVar111._4_4_ = uVar104;
    auVar111._0_4_ = uVar104;
    auVar111._8_4_ = uVar104;
    auVar111._12_4_ = uVar104;
    auVar61 = vfmadd213ps_fma(local_e8,auVar111,local_288);
    auVar43 = vfmadd213ps_fma(local_f8,auVar111,local_298);
    auVar46 = vfmadd213ps_fma(local_108,auVar111,local_2a8);
    auVar56 = vsubps_avx(auVar43,auVar61);
    auVar61 = vfmadd213ps_fma(auVar56,auVar111,auVar61);
    auVar56 = vsubps_avx(auVar46,auVar43);
    auVar56 = vfmadd213ps_fma(auVar56,auVar111,auVar43);
    auVar56 = vsubps_avx(auVar56,auVar61);
    auVar61 = vfmadd231ps_fma(auVar61,auVar56,auVar111);
    auVar44 = vmulps_avx512vl(auVar56,auVar55);
    auVar217._8_8_ = auVar61._0_8_;
    auVar217._0_8_ = auVar61._0_8_;
    auVar56 = vshufpd_avx(auVar61,auVar61,3);
    auVar61 = vshufps_avx(auVar47,auVar47,0x55);
    auVar43 = vsubps_avx(auVar56,auVar217);
    auVar46 = vfmadd231ps_fma(auVar217,auVar61,auVar43);
    auVar230._8_8_ = auVar44._0_8_;
    auVar230._0_8_ = auVar44._0_8_;
    auVar56 = vshufpd_avx(auVar44,auVar44,3);
    auVar56 = vsubps_avx512vl(auVar56,auVar230);
    auVar56 = vfmadd213ps_avx512vl(auVar56,auVar61,auVar230);
    auVar112._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
    auVar112._8_4_ = auVar43._8_4_ ^ 0x80000000;
    auVar112._12_4_ = auVar43._12_4_ ^ 0x80000000;
    auVar61 = vmovshdup_avx512vl(auVar56);
    auVar231._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
    auVar231._8_4_ = auVar61._8_4_ ^ 0x80000000;
    auVar231._12_4_ = auVar61._12_4_ ^ 0x80000000;
    auVar44 = vmovshdup_avx512vl(auVar43);
    auVar45 = vpermt2ps_avx512vl(auVar231,ZEXT416(5),auVar43);
    auVar61 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar61._0_4_ * auVar43._0_4_)),auVar56,auVar44);
    auVar43 = vpermt2ps_avx512vl(auVar56,SUB6416(ZEXT464(4),0),auVar112);
    auVar138._0_4_ = auVar61._0_4_;
    auVar138._4_4_ = auVar138._0_4_;
    auVar138._8_4_ = auVar138._0_4_;
    auVar138._12_4_ = auVar138._0_4_;
    auVar56 = vdivps_avx(auVar45,auVar138);
    auVar54 = vdivps_avx512vl(auVar43,auVar138);
    fVar209 = auVar46._0_4_;
    auVar61 = vshufps_avx(auVar46,auVar46,0x55);
    auVar218._0_4_ = fVar209 * auVar56._0_4_ + auVar61._0_4_ * auVar54._0_4_;
    auVar218._4_4_ = fVar209 * auVar56._4_4_ + auVar61._4_4_ * auVar54._4_4_;
    auVar218._8_4_ = fVar209 * auVar56._8_4_ + auVar61._8_4_ * auVar54._8_4_;
    auVar218._12_4_ = fVar209 * auVar56._12_4_ + auVar61._12_4_ * auVar54._12_4_;
    auVar48 = vsubps_avx(auVar59,auVar218);
    auVar61 = vmovshdup_avx(auVar56);
    auVar59 = vinsertps_avx(auVar179,auVar212,0x1c);
    auVar232._0_4_ = auVar61._0_4_ * auVar59._0_4_;
    auVar232._4_4_ = auVar61._4_4_ * auVar59._4_4_;
    auVar232._8_4_ = auVar61._8_4_ * auVar59._8_4_;
    auVar232._12_4_ = auVar61._12_4_ * auVar59._12_4_;
    auVar50 = vinsertps_avx512f(auVar168,auVar198,0x1c);
    auVar61 = vmulps_avx512vl(auVar61,auVar50);
    auVar45 = vminps_avx512vl(auVar232,auVar61);
    auVar46 = vmaxps_avx(auVar61,auVar232);
    auVar44 = vmovshdup_avx(auVar54);
    auVar61 = vinsertps_avx(auVar212,auVar179,0x4c);
    auVar213._0_4_ = auVar44._0_4_ * auVar61._0_4_;
    auVar213._4_4_ = auVar44._4_4_ * auVar61._4_4_;
    auVar213._8_4_ = auVar44._8_4_ * auVar61._8_4_;
    auVar213._12_4_ = auVar44._12_4_ * auVar61._12_4_;
    auVar43 = vinsertps_avx(auVar198,auVar168,0x4c);
    auVar199._0_4_ = auVar44._0_4_ * auVar43._0_4_;
    auVar199._4_4_ = auVar44._4_4_ * auVar43._4_4_;
    auVar199._8_4_ = auVar44._8_4_ * auVar43._8_4_;
    auVar199._12_4_ = auVar44._12_4_ * auVar43._12_4_;
    auVar44 = vminps_avx(auVar213,auVar199);
    auVar45 = vaddps_avx512vl(auVar45,auVar44);
    auVar44 = vmaxps_avx(auVar199,auVar213);
    auVar200._0_4_ = auVar46._0_4_ + auVar44._0_4_;
    auVar200._4_4_ = auVar46._4_4_ + auVar44._4_4_;
    auVar200._8_4_ = auVar46._8_4_ + auVar44._8_4_;
    auVar200._12_4_ = auVar46._12_4_ + auVar44._12_4_;
    auVar214._8_8_ = 0x3f80000000000000;
    auVar214._0_8_ = 0x3f80000000000000;
    auVar46 = vsubps_avx(auVar214,auVar200);
    auVar44 = vsubps_avx(auVar214,auVar45);
    auVar45 = vsubps_avx(auVar62,auVar47);
    auVar47 = vsubps_avx(auVar53,auVar47);
    fVar206 = auVar45._0_4_;
    auVar233._0_4_ = fVar206 * auVar46._0_4_;
    fVar207 = auVar45._4_4_;
    auVar233._4_4_ = fVar207 * auVar46._4_4_;
    fVar208 = auVar45._8_4_;
    auVar233._8_4_ = fVar208 * auVar46._8_4_;
    fVar127 = auVar45._12_4_;
    auVar233._12_4_ = fVar127 * auVar46._12_4_;
    auVar57 = vbroadcastss_avx512vl(auVar56);
    auVar59 = vmulps_avx512vl(auVar57,auVar59);
    auVar50 = vmulps_avx512vl(auVar57,auVar50);
    auVar57 = vminps_avx512vl(auVar59,auVar50);
    auVar50 = vmaxps_avx512vl(auVar50,auVar59);
    auVar59 = vbroadcastss_avx512vl(auVar54);
    auVar61 = vmulps_avx512vl(auVar59,auVar61);
    auVar59 = vmulps_avx512vl(auVar59,auVar43);
    auVar43 = vminps_avx512vl(auVar61,auVar59);
    auVar43 = vaddps_avx512vl(auVar57,auVar43);
    auVar45 = vmulps_avx512vl(auVar45,auVar44);
    auVar235 = ZEXT1664(auVar45);
    fVar209 = auVar47._0_4_;
    auVar201._0_4_ = fVar209 * auVar46._0_4_;
    fVar193 = auVar47._4_4_;
    auVar201._4_4_ = fVar193 * auVar46._4_4_;
    fVar204 = auVar47._8_4_;
    auVar201._8_4_ = fVar204 * auVar46._8_4_;
    fVar205 = auVar47._12_4_;
    auVar201._12_4_ = fVar205 * auVar46._12_4_;
    auVar215._0_4_ = fVar209 * auVar44._0_4_;
    auVar215._4_4_ = fVar193 * auVar44._4_4_;
    auVar215._8_4_ = fVar204 * auVar44._8_4_;
    auVar215._12_4_ = fVar205 * auVar44._12_4_;
    auVar59 = vmaxps_avx(auVar59,auVar61);
    auVar169._0_4_ = auVar50._0_4_ + auVar59._0_4_;
    auVar169._4_4_ = auVar50._4_4_ + auVar59._4_4_;
    auVar169._8_4_ = auVar50._8_4_ + auVar59._8_4_;
    auVar169._12_4_ = auVar50._12_4_ + auVar59._12_4_;
    auVar180._8_8_ = 0x3f800000;
    auVar180._0_8_ = 0x3f800000;
    auVar59 = vsubps_avx(auVar180,auVar169);
    auVar61 = vsubps_avx512vl(auVar180,auVar43);
    auVar224._0_4_ = fVar206 * auVar59._0_4_;
    auVar224._4_4_ = fVar207 * auVar59._4_4_;
    auVar224._8_4_ = fVar208 * auVar59._8_4_;
    auVar224._12_4_ = fVar127 * auVar59._12_4_;
    auVar219._0_4_ = fVar206 * auVar61._0_4_;
    auVar219._4_4_ = fVar207 * auVar61._4_4_;
    auVar219._8_4_ = fVar208 * auVar61._8_4_;
    auVar219._12_4_ = fVar127 * auVar61._12_4_;
    auVar170._0_4_ = fVar209 * auVar59._0_4_;
    auVar170._4_4_ = fVar193 * auVar59._4_4_;
    auVar170._8_4_ = fVar204 * auVar59._8_4_;
    auVar170._12_4_ = fVar205 * auVar59._12_4_;
    auVar181._0_4_ = fVar209 * auVar61._0_4_;
    auVar181._4_4_ = fVar193 * auVar61._4_4_;
    auVar181._8_4_ = fVar204 * auVar61._8_4_;
    auVar181._12_4_ = fVar205 * auVar61._12_4_;
    auVar59 = vminps_avx(auVar224,auVar219);
    auVar61 = vminps_avx512vl(auVar170,auVar181);
    auVar234 = ZEXT1664(auVar61);
    auVar43 = vminps_avx512vl(auVar59,auVar61);
    auVar59 = vmaxps_avx(auVar219,auVar224);
    auVar61 = vmaxps_avx(auVar181,auVar170);
    auVar61 = vmaxps_avx(auVar61,auVar59);
    auVar46 = vminps_avx512vl(auVar233,auVar45);
    auVar59 = vminps_avx(auVar201,auVar215);
    auVar59 = vminps_avx(auVar46,auVar59);
    auVar59 = vhaddps_avx(auVar43,auVar59);
    auVar46 = vmaxps_avx512vl(auVar45,auVar233);
    auVar43 = vmaxps_avx(auVar215,auVar201);
    auVar43 = vmaxps_avx(auVar43,auVar46);
    auVar61 = vhaddps_avx(auVar61,auVar43);
    auVar59 = vshufps_avx(auVar59,auVar59,0xe8);
    auVar61 = vshufps_avx(auVar61,auVar61,0xe8);
    auVar171._0_4_ = auVar59._0_4_ + auVar48._0_4_;
    auVar171._4_4_ = auVar59._4_4_ + auVar48._4_4_;
    auVar171._8_4_ = auVar59._8_4_ + auVar48._8_4_;
    auVar171._12_4_ = auVar59._12_4_ + auVar48._12_4_;
    auVar182._0_4_ = auVar61._0_4_ + auVar48._0_4_;
    auVar182._4_4_ = auVar61._4_4_ + auVar48._4_4_;
    auVar182._8_4_ = auVar61._8_4_ + auVar48._8_4_;
    auVar182._12_4_ = auVar61._12_4_ + auVar48._12_4_;
    auVar59 = vmaxps_avx(auVar62,auVar171);
    auVar61 = vminps_avx(auVar182,auVar53);
    uVar1 = vcmpps_avx512vl(auVar61,auVar59,1);
  } while ((uVar1 & 3) != 0);
  uVar1 = vcmpps_avx512vl(auVar182,auVar53,1);
  uVar14 = vcmpps_avx512vl(auVar41,auVar171,1);
  if (((ushort)uVar14 & (ushort)uVar1 & 1) == 0) {
    bVar26 = 0;
  }
  else {
    auVar59 = vmovshdup_avx(auVar171);
    bVar26 = auVar51._0_4_ < auVar59._0_4_ & (byte)(uVar1 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar28 || uVar6 != 0 && !bVar39) | bVar26) != 1) goto LAB_01b83875;
  lVar30 = 0xc9;
  do {
    lVar30 = lVar30 + -1;
    if (lVar30 == 0) goto LAB_01b82a93;
    auVar41 = vsubss_avx512f(auVar49,auVar48);
    fVar204 = auVar41._0_4_;
    fVar209 = fVar204 * fVar204 * fVar204;
    auVar41 = vmulss_avx512f(auVar48,ZEXT416(0x40400000));
    fVar193 = auVar41._0_4_ * fVar204 * fVar204;
    fVar205 = auVar48._0_4_;
    auVar41 = vmulss_avx512f(ZEXT416((uint)(fVar205 * fVar205)),ZEXT416(0x40400000));
    fVar204 = fVar204 * auVar41._0_4_;
    auVar124._4_4_ = fVar209;
    auVar124._0_4_ = fVar209;
    auVar124._8_4_ = fVar209;
    auVar124._12_4_ = fVar209;
    auVar119._4_4_ = fVar193;
    auVar119._0_4_ = fVar193;
    auVar119._8_4_ = fVar193;
    auVar119._12_4_ = fVar193;
    auVar106._4_4_ = fVar204;
    auVar106._0_4_ = fVar204;
    auVar106._8_4_ = fVar204;
    auVar106._12_4_ = fVar204;
    fVar205 = fVar205 * fVar205 * fVar205;
    auVar150._0_4_ = (float)local_118._0_4_ * fVar205;
    auVar150._4_4_ = (float)local_118._4_4_ * fVar205;
    auVar150._8_4_ = fStack_110 * fVar205;
    auVar150._12_4_ = fStack_10c * fVar205;
    auVar41 = vfmadd231ps_fma(auVar150,local_2a8,auVar106);
    auVar41 = vfmadd231ps_fma(auVar41,local_298,auVar119);
    auVar41 = vfmadd231ps_fma(auVar41,local_288,auVar124);
    auVar107._8_8_ = auVar41._0_8_;
    auVar107._0_8_ = auVar41._0_8_;
    auVar41 = vshufpd_avx(auVar41,auVar41,3);
    auVar59 = vshufps_avx(auVar48,auVar48,0x55);
    auVar41 = vsubps_avx(auVar41,auVar107);
    auVar59 = vfmadd213ps_fma(auVar41,auVar59,auVar107);
    fVar209 = auVar59._0_4_;
    auVar41 = vshufps_avx(auVar59,auVar59,0x55);
    auVar108._0_4_ = auVar56._0_4_ * fVar209 + auVar54._0_4_ * auVar41._0_4_;
    auVar108._4_4_ = auVar56._4_4_ * fVar209 + auVar54._4_4_ * auVar41._4_4_;
    auVar108._8_4_ = auVar56._8_4_ * fVar209 + auVar54._8_4_ * auVar41._8_4_;
    auVar108._12_4_ = auVar56._12_4_ * fVar209 + auVar54._12_4_ * auVar41._12_4_;
    auVar48 = vsubps_avx(auVar48,auVar108);
    auVar41 = vandps_avx512vl(auVar59,auVar244._0_16_);
    auVar59 = vprolq_avx512vl(auVar41,0x20);
    auVar41 = vmaxss_avx(auVar59,auVar41);
    bVar39 = (float)local_128._0_4_ < auVar41._0_4_;
  } while ((float)local_128._0_4_ <= auVar41._0_4_);
  auVar41 = vucomiss_avx512f(auVar42);
  if (bVar39) goto LAB_01b82a93;
  auVar56 = vucomiss_avx512f(auVar41);
  auVar243 = ZEXT1664(auVar56);
  if (bVar39) goto LAB_01b82a93;
  vmovshdup_avx(auVar41);
  auVar56 = vucomiss_avx512f(auVar42);
  if (bVar39) goto LAB_01b82a93;
  auVar59 = vucomiss_avx512f(auVar56);
  auVar243 = ZEXT1664(auVar59);
  if (bVar39) goto LAB_01b82a93;
  auVar61 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar48 = vinsertps_avx(auVar61,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar2 = (ray->org).field_0;
  auVar61 = vsubps_avx(local_1b8,(undefined1  [16])aVar2);
  auVar61 = vdpps_avx(auVar61,auVar48,0x7f);
  auVar62 = vsubps_avx(local_1c8,(undefined1  [16])aVar2);
  auVar62 = vdpps_avx(auVar62,auVar48,0x7f);
  auVar43 = vsubps_avx(local_1d8,(undefined1  [16])aVar2);
  auVar43 = vdpps_avx(auVar43,auVar48,0x7f);
  auVar46 = vsubps_avx(local_1e8,(undefined1  [16])aVar2);
  auVar46 = vdpps_avx(auVar46,auVar48,0x7f);
  auVar44 = vsubps_avx(_local_1f8,(undefined1  [16])aVar2);
  auVar44 = vdpps_avx(auVar44,auVar48,0x7f);
  auVar45 = vsubps_avx(_local_208,(undefined1  [16])aVar2);
  auVar45 = vdpps_avx(auVar45,auVar48,0x7f);
  auVar47 = vsubps_avx(_local_218,(undefined1  [16])aVar2);
  auVar47 = vdpps_avx(auVar47,auVar48,0x7f);
  auVar49 = vsubps_avx(_local_228,(undefined1  [16])aVar2);
  auVar48 = vdpps_avx(auVar49,auVar48,0x7f);
  auVar49 = vsubss_avx512f(auVar59,auVar56);
  fVar209 = auVar56._0_4_;
  auVar56 = vfmadd231ss_fma(ZEXT416((uint)(auVar44._0_4_ * fVar209)),auVar49,auVar61);
  auVar61 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ * fVar209)),auVar49,auVar62);
  auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * fVar209)),auVar49,auVar43);
  auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar48._0_4_)),auVar49,auVar46);
  auVar59 = vsubss_avx512f(auVar59,auVar41);
  auVar151._0_4_ = auVar59._0_4_;
  fVar193 = auVar151._0_4_ * auVar151._0_4_ * auVar151._0_4_;
  auVar59 = vmulss_avx512f(auVar41,ZEXT416(0x40400000));
  fVar204 = auVar59._0_4_ * auVar151._0_4_ * auVar151._0_4_;
  fVar209 = auVar41._0_4_;
  auVar139._0_4_ = fVar209 * fVar209;
  auVar139._4_4_ = auVar41._4_4_ * auVar41._4_4_;
  auVar139._8_4_ = auVar41._8_4_ * auVar41._8_4_;
  auVar139._12_4_ = auVar41._12_4_ * auVar41._12_4_;
  auVar59 = vmulss_avx512f(auVar139,ZEXT416(0x40400000));
  fVar205 = auVar151._0_4_ * auVar59._0_4_;
  fVar207 = fVar209 * auVar139._0_4_;
  auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * auVar43._0_4_)),ZEXT416((uint)fVar205),auVar62)
  ;
  auVar59 = vfmadd231ss_fma(auVar59,ZEXT416((uint)fVar204),auVar61);
  auVar56 = vfmadd231ss_fma(auVar59,ZEXT416((uint)fVar193),auVar56);
  fVar206 = auVar56._0_4_;
  if ((fVar206 < (ray->org).field_0.m128[3]) || (fVar208 = ray->tfar, fVar208 < fVar206))
  goto LAB_01b82a93;
  auVar56 = vshufps_avx(auVar41,auVar41,0x55);
  auVar61 = vsubps_avx512vl(auVar60,auVar56);
  fVar127 = auVar56._0_4_;
  auVar183._0_4_ = fVar127 * (float)local_1f8._0_4_;
  fVar161 = auVar56._4_4_;
  auVar183._4_4_ = fVar161 * (float)local_1f8._4_4_;
  fVar162 = auVar56._8_4_;
  auVar183._8_4_ = fVar162 * fStack_1f0;
  fVar163 = auVar56._12_4_;
  auVar183._12_4_ = fVar163 * fStack_1ec;
  auVar189._0_4_ = fVar127 * (float)local_208._0_4_;
  auVar189._4_4_ = fVar161 * (float)local_208._4_4_;
  auVar189._8_4_ = fVar162 * fStack_200;
  auVar189._12_4_ = fVar163 * fStack_1fc;
  auVar202._0_4_ = fVar127 * (float)local_218._0_4_;
  auVar202._4_4_ = fVar161 * (float)local_218._4_4_;
  auVar202._8_4_ = fVar162 * fStack_210;
  auVar202._12_4_ = fVar163 * fStack_20c;
  auVar157._0_4_ = fVar127 * (float)local_228._0_4_;
  auVar157._4_4_ = fVar161 * (float)local_228._4_4_;
  auVar157._8_4_ = fVar162 * fStack_220;
  auVar157._12_4_ = fVar163 * fStack_21c;
  auVar56 = vfmadd231ps_fma(auVar183,auVar61,local_1b8);
  auVar60 = vfmadd231ps_fma(auVar189,auVar61,local_1c8);
  auVar59 = vfmadd231ps_fma(auVar202,auVar61,local_1d8);
  auVar61 = vfmadd231ps_fma(auVar157,auVar61,local_1e8);
  auVar56 = vsubps_avx(auVar60,auVar56);
  auVar60 = vsubps_avx(auVar59,auVar60);
  auVar59 = vsubps_avx(auVar61,auVar59);
  auVar203._0_4_ = fVar209 * auVar60._0_4_;
  auVar203._4_4_ = fVar209 * auVar60._4_4_;
  auVar203._8_4_ = fVar209 * auVar60._8_4_;
  auVar203._12_4_ = fVar209 * auVar60._12_4_;
  auVar151._4_4_ = auVar151._0_4_;
  auVar151._8_4_ = auVar151._0_4_;
  auVar151._12_4_ = auVar151._0_4_;
  auVar56 = vfmadd231ps_fma(auVar203,auVar151,auVar56);
  auVar158._0_4_ = fVar209 * auVar59._0_4_;
  auVar158._4_4_ = fVar209 * auVar59._4_4_;
  auVar158._8_4_ = fVar209 * auVar59._8_4_;
  auVar158._12_4_ = fVar209 * auVar59._12_4_;
  auVar60 = vfmadd231ps_fma(auVar158,auVar151,auVar60);
  auVar159._0_4_ = fVar209 * auVar60._0_4_;
  auVar159._4_4_ = fVar209 * auVar60._4_4_;
  auVar159._8_4_ = fVar209 * auVar60._8_4_;
  auVar159._12_4_ = fVar209 * auVar60._12_4_;
  auVar56 = vfmadd231ps_fma(auVar159,auVar151,auVar56);
  auVar55 = vmulps_avx512vl(auVar56,auVar55);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  if ((pGVar7->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar26 = 1, pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01b8386a;
    auVar140._0_4_ = fVar207 * (float)local_168._0_4_;
    auVar140._4_4_ = fVar207 * (float)local_168._4_4_;
    auVar140._8_4_ = fVar207 * fStack_160;
    auVar140._12_4_ = fVar207 * fStack_15c;
    auVar125._4_4_ = fVar205;
    auVar125._0_4_ = fVar205;
    auVar125._8_4_ = fVar205;
    auVar125._12_4_ = fVar205;
    auVar56 = vfmadd132ps_fma(auVar125,auVar140,local_158);
    auVar120._4_4_ = fVar204;
    auVar120._0_4_ = fVar204;
    auVar120._8_4_ = fVar204;
    auVar120._12_4_ = fVar204;
    auVar56 = vfmadd132ps_fma(auVar120,auVar56,local_148);
    auVar113._4_4_ = fVar193;
    auVar113._0_4_ = fVar193;
    auVar113._8_4_ = fVar193;
    auVar113._12_4_ = fVar193;
    auVar59 = vfmadd132ps_fma(auVar113,auVar56,local_138);
    auVar56 = vshufps_avx(auVar59,auVar59,0xc9);
    auVar60 = vshufps_avx(auVar55,auVar55,0xc9);
    auVar114._0_4_ = auVar59._0_4_ * auVar60._0_4_;
    auVar114._4_4_ = auVar59._4_4_ * auVar60._4_4_;
    auVar114._8_4_ = auVar59._8_4_ * auVar60._8_4_;
    auVar114._12_4_ = auVar59._12_4_ * auVar60._12_4_;
    auVar56 = vfmsub231ps_fma(auVar114,auVar55,auVar56);
    auVar55 = vshufps_avx(auVar56,auVar56,0xe9);
    local_198 = vmovlps_avx(auVar55);
    local_190 = auVar56._0_4_;
    local_18c = vmovlps_avx(auVar41);
    local_184 = (int)local_268;
    local_180 = uVar5;
    local_17c = context->user->instID[0];
    local_178 = context->user->instPrimID[0];
    ray->tfar = fVar206;
    local_32c = -1;
    local_258.valid = &local_32c;
    local_258.geometryUserPtr = pGVar7->userPtr;
    local_258.context = context->user;
    local_258.hit = (RTCHitN *)&local_198;
    local_258.N = 1;
    local_258.ray = (RTCRayN *)ray;
    if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b83794:
      auVar41 = auVar236._0_16_;
      p_Var10 = context->args->filter;
      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var10)(&local_258);
        auVar240 = ZEXT3264(_DAT_01fb9fe0);
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar239 = ZEXT1664(auVar42);
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar238 = ZEXT1664(auVar42);
        auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar237 = ZEXT3264(auVar82);
        auVar70._16_16_ = auVar82._16_16_;
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar245 = ZEXT1664(auVar42);
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar244 = ZEXT1664(auVar42);
        auVar243 = ZEXT464(0x3f800000);
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar242 = ZEXT1664(auVar42);
        auVar41 = vxorps_avx512vl(auVar41,auVar41);
        auVar236 = ZEXT1664(auVar41);
        if (*local_258.valid == 0) goto LAB_01b8385c;
      }
      bVar26 = 1;
      goto LAB_01b8386a;
    }
    local_270 = lVar34;
    (*pGVar7->occlusionFilterN)(&local_258);
    auVar240 = ZEXT3264(_DAT_01fb9fe0);
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar239 = ZEXT1664(auVar41);
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar238 = ZEXT1664(auVar41);
    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar237 = ZEXT3264(auVar82);
    auVar70._16_16_ = auVar82._16_16_;
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar245 = ZEXT1664(auVar41);
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar244 = ZEXT1664(auVar41);
    auVar243 = ZEXT464(0x3f800000);
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar242 = ZEXT1664(auVar41);
    auVar41 = vxorps_avx512vl(auVar42,auVar42);
    auVar236 = ZEXT1664(auVar41);
    lVar34 = local_270;
    if (*local_258.valid != 0) goto LAB_01b83794;
LAB_01b8385c:
    auVar243 = ZEXT464(0x3f800000);
    ray->tfar = fVar208;
  }
  bVar26 = 0;
LAB_01b8386a:
  bVar36 = (bool)(bVar36 | bVar26);
  goto LAB_01b82a93;
LAB_01b83875:
  auVar46 = vinsertps_avx(auVar51,auVar52,0x10);
  goto LAB_01b82598;
}

Assistant:

static __forceinline bool occluded_hn(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }